

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O2

void run_extrakeys_tests(void)

{
  uchar *b32;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  secp256k1_context *psVar17;
  int iVar18;
  int iVar19;
  secp256k1_ge *pubkey;
  secp256k1_pubkey *pubkey_00;
  char *pcVar20;
  long lVar21;
  secp256k1_ge *pubkey_01;
  char cVar22;
  undefined4 uVar23;
  undefined1 auVar24 [16];
  undefined8 uStack_e50;
  int pk_parity;
  int32_t _calls_to_callback_3;
  undefined1 auStack_e34 [8];
  undefined4 uStack_e2c;
  undefined1 local_e28 [16];
  secp256k1_xonly_pubkey xonly_pk;
  uchar buf32 [32];
  uchar sk [32];
  secp256k1_xonly_pubkey xonly_pk_tmp;
  secp256k1_pubkey pk;
  uchar tweak [32];
  uchar xy_sk [32];
  uchar zeros64 [64];
  int32_t _calls_to_callback_5;
  uchar ones32 [32];
  secp256k1_ge pk2;
  uchar auStack_bc0 [904];
  secp256k1_ge pk1;
  undefined1 uStack_7e0;
  undefined1 uStack_7df;
  undefined1 uStack_7de;
  undefined1 uStack_7dd;
  undefined1 uStack_7dc;
  undefined1 uStack_7db;
  undefined1 uStack_7da;
  undefined1 uStack_7d9;
  secp256k1_pubkey local_b8 [2];
  
  zeros64[0x30] = '\0';
  zeros64[0x31] = '\0';
  zeros64[0x32] = '\0';
  zeros64[0x33] = '\0';
  zeros64[0x34] = '\0';
  zeros64[0x35] = '\0';
  zeros64[0x36] = '\0';
  zeros64[0x37] = '\0';
  zeros64[0x38] = '\0';
  zeros64[0x39] = '\0';
  zeros64[0x3a] = '\0';
  zeros64[0x3b] = '\0';
  zeros64[0x3c] = '\0';
  zeros64[0x3d] = '\0';
  zeros64[0x3e] = '\0';
  zeros64[0x3f] = '\0';
  zeros64[0x20] = '\0';
  zeros64[0x21] = '\0';
  zeros64[0x22] = '\0';
  zeros64[0x23] = '\0';
  zeros64[0x24] = '\0';
  zeros64[0x25] = '\0';
  zeros64[0x26] = '\0';
  zeros64[0x27] = '\0';
  zeros64[0x28] = '\0';
  zeros64[0x29] = '\0';
  zeros64[0x2a] = '\0';
  zeros64[0x2b] = '\0';
  zeros64[0x2c] = '\0';
  zeros64[0x2d] = '\0';
  zeros64[0x2e] = '\0';
  zeros64[0x2f] = '\0';
  zeros64[0x10] = '\0';
  zeros64[0x11] = '\0';
  zeros64[0x12] = '\0';
  zeros64[0x13] = '\0';
  zeros64[0x14] = '\0';
  zeros64[0x15] = '\0';
  zeros64[0x16] = '\0';
  zeros64[0x17] = '\0';
  zeros64[0x18] = '\0';
  zeros64[0x19] = '\0';
  zeros64[0x1a] = '\0';
  zeros64[0x1b] = '\0';
  zeros64[0x1c] = '\0';
  zeros64[0x1d] = '\0';
  zeros64[0x1e] = '\0';
  zeros64[0x1f] = '\0';
  zeros64[0] = '\0';
  zeros64[1] = '\0';
  zeros64[2] = '\0';
  zeros64[3] = '\0';
  zeros64[4] = '\0';
  zeros64[5] = '\0';
  zeros64[6] = '\0';
  zeros64[7] = '\0';
  zeros64[8] = '\0';
  zeros64[9] = '\0';
  zeros64[10] = '\0';
  zeros64[0xb] = '\0';
  zeros64[0xc] = '\0';
  zeros64[0xd] = '\0';
  zeros64[0xe] = '\0';
  zeros64[0xf] = '\0';
  testrand256(sk);
  ones32[0x10] = 0xff;
  ones32[0x11] = 0xff;
  ones32[0x12] = 0xff;
  ones32[0x13] = 0xff;
  ones32[0x14] = 0xff;
  ones32[0x15] = 0xff;
  ones32[0x16] = 0xff;
  ones32[0x17] = 0xff;
  ones32[0x18] = 0xff;
  ones32[0x19] = 0xff;
  ones32[0x1a] = 0xff;
  ones32[0x1b] = 0xff;
  ones32[0x1c] = 0xff;
  ones32[0x1d] = 0xff;
  ones32[0x1e] = 0xff;
  ones32[0x1f] = 0xff;
  ones32[0] = 0xff;
  ones32[1] = 0xff;
  ones32[2] = 0xff;
  ones32[3] = 0xff;
  ones32[4] = 0xff;
  ones32[5] = 0xff;
  ones32[6] = 0xff;
  ones32[7] = 0xff;
  ones32[8] = 0xff;
  ones32[9] = 0xff;
  ones32[10] = 0xff;
  ones32[0xb] = 0xff;
  ones32[0xc] = 0xff;
  ones32[0xd] = 0xff;
  ones32[0xe] = 0xff;
  ones32[0xf] = 0xff;
  testrand256(xy_sk);
  iVar18 = secp256k1_ec_pubkey_create(CTX,&pk,sk);
  if (iVar18 == 0) {
    pcVar20 = "test condition failed: secp256k1_ec_pubkey_create(CTX, &pk, sk) == 1";
    uStack_e50 = 0x1d;
  }
  else {
    iVar18 = secp256k1_xonly_pubkey_from_pubkey(CTX,&xonly_pk,&pk_parity,&pk);
    if (iVar18 == 0) {
      pcVar20 = 
      "test condition failed: secp256k1_xonly_pubkey_from_pubkey(CTX, &xonly_pk, &pk_parity, &pk) == 1"
      ;
      uStack_e50 = 0x1e;
    }
    else {
      iVar18 = secp256k1_xonly_pubkey_from_pubkey(CTX,&xonly_pk,&pk_parity,&pk);
      if (iVar18 == 0) {
        pcVar20 = 
        "test condition failed: secp256k1_xonly_pubkey_from_pubkey(CTX, &xonly_pk, &pk_parity, &pk) == 1"
        ;
        uStack_e50 = 0x21;
      }
      else {
        auVar24._12_4_ = 0;
        auVar24._0_12_ = (undefined1  [12])pk2.x.n._4_12_;
        pk2.x.n._0_16_ = auVar24 << 0x20;
        pk1.x.n._0_16_ = CTX->illegal_callback;
        secp256k1_context_set_illegal_callback(CTX,counting_callback_fn,&pk2);
        (*(CTX->illegal_callback).fn)("xonly_pubkey != NULL",(CTX->illegal_callback).data);
        psVar17 = CTX;
        (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)pk1.x.n[0];
        (psVar17->illegal_callback).data = (void *)pk1.x.n[1];
        if ((int)pk2.x.n[0] == 1) {
          iVar18 = secp256k1_xonly_pubkey_from_pubkey(psVar17,&xonly_pk,(int *)0x0,&pk);
          if (iVar18 == 0) {
            pcVar20 = 
            "test condition failed: secp256k1_xonly_pubkey_from_pubkey(CTX, &xonly_pk, NULL, &pk) == 1"
            ;
            uStack_e50 = 0x23;
          }
          else {
            auVar1._12_4_ = 0;
            auVar1._0_12_ = (undefined1  [12])pk2.x.n._4_12_;
            pk2.x.n._0_16_ = auVar1 << 0x20;
            pk1.x.n._0_16_ = CTX->illegal_callback;
            secp256k1_context_set_illegal_callback(CTX,counting_callback_fn,&pk2);
            (*(CTX->illegal_callback).fn)("pubkey != NULL",(CTX->illegal_callback).data);
            psVar17 = CTX;
            (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)pk1.x.n[0];
            (psVar17->illegal_callback).data = (void *)pk1.x.n[1];
            if ((int)pk2.x.n[0] == 1) {
              pk.data[0] = '\0';
              pk.data[1] = '\0';
              pk.data[2] = '\0';
              pk.data[3] = '\0';
              pk.data[4] = '\0';
              pk.data[5] = '\0';
              pk.data[6] = '\0';
              pk.data[7] = '\0';
              pk.data[8] = '\0';
              pk.data[9] = '\0';
              pk.data[10] = '\0';
              pk.data[0xb] = '\0';
              pk.data[0xc] = '\0';
              pk.data[0xd] = '\0';
              pk.data[0xe] = '\0';
              pk.data[0xf] = '\0';
              pk.data[0x10] = '\0';
              pk.data[0x11] = '\0';
              pk.data[0x12] = '\0';
              pk.data[0x13] = '\0';
              pk.data[0x14] = '\0';
              pk.data[0x15] = '\0';
              pk.data[0x16] = '\0';
              pk.data[0x17] = '\0';
              pk.data[0x18] = '\0';
              pk.data[0x19] = '\0';
              pk.data[0x1a] = '\0';
              pk.data[0x1b] = '\0';
              pk.data[0x1c] = '\0';
              pk.data[0x1d] = '\0';
              pk.data[0x1e] = '\0';
              pk.data[0x1f] = '\0';
              auVar2._12_4_ = 0;
              auVar2._0_12_ = (undefined1  [12])pk2.x.n._4_12_;
              pk2.x.n._0_16_ = auVar2 << 0x20;
              pk.data[0x20] = '\0';
              pk.data[0x21] = '\0';
              pk.data[0x22] = '\0';
              pk.data[0x23] = '\0';
              pk.data[0x24] = '\0';
              pk.data[0x25] = '\0';
              pk.data[0x26] = '\0';
              pk.data[0x27] = '\0';
              pk.data[0x28] = '\0';
              pk.data[0x29] = '\0';
              pk.data[0x2a] = '\0';
              pk.data[0x2b] = '\0';
              pk.data[0x2c] = '\0';
              pk.data[0x2d] = '\0';
              pk.data[0x2e] = '\0';
              pk.data[0x2f] = '\0';
              pk.data[0x30] = '\0';
              pk.data[0x31] = '\0';
              pk.data[0x32] = '\0';
              pk.data[0x33] = '\0';
              pk.data[0x34] = '\0';
              pk.data[0x35] = '\0';
              pk.data[0x36] = '\0';
              pk.data[0x37] = '\0';
              pk.data[0x38] = '\0';
              pk.data[0x39] = '\0';
              pk.data[0x3a] = '\0';
              pk.data[0x3b] = '\0';
              pk.data[0x3c] = '\0';
              pk.data[0x3d] = '\0';
              pk.data[0x3e] = '\0';
              pk.data[0x3f] = '\0';
              pk1.x.n._0_16_ = psVar17->illegal_callback;
              secp256k1_context_set_illegal_callback(psVar17,counting_callback_fn,&pk2);
              iVar18 = secp256k1_xonly_pubkey_from_pubkey(CTX,&xonly_pk,&pk_parity,&pk);
              psVar17 = CTX;
              if (iVar18 == 0) {
                (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)pk1.x.n[0];
                (psVar17->illegal_callback).data = (void *)pk1.x.n[1];
                if ((int)pk2.x.n[0] == 1) {
                  sk[0x10] = '\0';
                  sk[0x11] = '\0';
                  sk[0x12] = '\0';
                  sk[0x13] = '\0';
                  sk[0x14] = '\0';
                  sk[0x15] = '\0';
                  sk[0x16] = '\0';
                  sk[0x17] = '\0';
                  sk[0x18] = '\0';
                  sk[0x19] = '\0';
                  sk[0x1a] = '\0';
                  sk[0x1b] = '\0';
                  sk[0x1c] = '\0';
                  sk[0x1d] = '\0';
                  sk[0x1e] = '\0';
                  sk[0x1f] = '\0';
                  sk._1_15_ = SUB1615((undefined1  [16])0x0,1);
                  sk[0] = '\x01';
                  iVar18 = secp256k1_ec_pubkey_create(psVar17,&pk,sk);
                  if (iVar18 == 0) {
                    pcVar20 = "test condition failed: secp256k1_ec_pubkey_create(CTX, &pk, sk) == 1"
                    ;
                    uStack_e50 = 0x2b;
                  }
                  else {
                    iVar18 = secp256k1_xonly_pubkey_from_pubkey(CTX,&xonly_pk,&pk_parity,&pk);
                    if (iVar18 == 0) {
                      pcVar20 = 
                      "test condition failed: secp256k1_xonly_pubkey_from_pubkey(CTX, &xonly_pk, &pk_parity, &pk) == 1"
                      ;
                      uStack_e50 = 0x2c;
                    }
                    else {
                      iVar18 = secp256k1_memcmp_var(&pk,&xonly_pk,0x40);
                      if (iVar18 == 0) {
                        if (pk_parity == 0) {
                          sk[0] = '\x02';
                          iVar18 = secp256k1_ec_pubkey_create(CTX,&pk,sk);
                          if (iVar18 == 0) {
                            pcVar20 = 
                            "test condition failed: secp256k1_ec_pubkey_create(CTX, &pk, sk) == 1";
                            uStack_e50 = 0x33;
                          }
                          else {
                            iVar18 = secp256k1_xonly_pubkey_from_pubkey
                                               (CTX,&xonly_pk,&pk_parity,&pk);
                            if (iVar18 == 0) {
                              pcVar20 = 
                              "test condition failed: secp256k1_xonly_pubkey_from_pubkey(CTX, &xonly_pk, &pk_parity, &pk) == 1"
                              ;
                              uStack_e50 = 0x34;
                            }
                            else {
                              iVar18 = secp256k1_memcmp_var(&xonly_pk,&pk,0x40);
                              if (iVar18 == 0) {
                                pcVar20 = 
                                "test condition failed: secp256k1_memcmp_var(&xonly_pk, &pk, sizeof(xonly_pk)) != 0"
                                ;
                                uStack_e50 = 0x35;
                              }
                              else if (pk_parity == 1) {
                                secp256k1_pubkey_load(CTX,&pk1,&pk);
                                secp256k1_pubkey_load(CTX,&pk2,(secp256k1_pubkey *)&xonly_pk);
                                iVar18 = secp256k1_fe_equal(&pk1.x,&pk2.x);
                                if (iVar18 == 0) {
                                  pcVar20 = 
                                  "test condition failed: secp256k1_fe_equal(&pk1.x, &pk2.x) == 1";
                                  uStack_e50 = 0x39;
                                }
                                else {
                                  tweak._0_8_ = 0x3ffffbfffff0bc - pk2.y.n[0];
                                  tweak._8_8_ = 0x3ffffffffffffc - pk2.y.n[1];
                                  tweak._16_8_ = 0x3ffffffffffffc - pk2.y.n[2];
                                  tweak._24_8_ = 0x3ffffffffffffc - pk2.y.n[3];
                                  iVar18 = secp256k1_fe_equal(&pk1.y,(secp256k1_fe *)tweak);
                                  if (iVar18 == 0) {
                                    pcVar20 = 
                                    "test condition failed: secp256k1_fe_equal(&pk1.y, &y) == 1";
                                    uStack_e50 = 0x3b;
                                  }
                                  else {
                                    auVar3._12_4_ = 0;
                                    auVar3._0_12_ = _auStack_e34;
                                    __calls_to_callback_3 = (secp256k1_callback)(auVar3 << 0x20);
                                    xonly_pk_tmp.data._0_16_ = CTX->illegal_callback;
                                    secp256k1_context_set_illegal_callback
                                              (CTX,counting_callback_fn,&_calls_to_callback_3);
                                    (*(CTX->illegal_callback).fn)
                                              ("output32 != NULL",(CTX->illegal_callback).data);
                                    psVar17 = CTX;
                                    (CTX->illegal_callback).fn =
                                         (_func_void_char_ptr_void_ptr *)xonly_pk_tmp.data._0_8_;
                                    (psVar17->illegal_callback).data =
                                         (void *)xonly_pk_tmp.data._8_8_;
                                    if (_calls_to_callback_3 == 1) {
                                      auVar4._12_4_ = 0;
                                      auVar4._0_12_ = _auStack_e34;
                                      __calls_to_callback_3 = (secp256k1_callback)(auVar4 << 0x20);
                                      xonly_pk_tmp.data._0_16_ = psVar17->illegal_callback;
                                      secp256k1_context_set_illegal_callback
                                                (psVar17,counting_callback_fn,&_calls_to_callback_3)
                                      ;
                                      buf32[0] = '\0';
                                      buf32[1] = '\0';
                                      buf32[2] = '\0';
                                      buf32[3] = '\0';
                                      buf32[4] = '\0';
                                      buf32[5] = '\0';
                                      buf32[6] = '\0';
                                      buf32[7] = '\0';
                                      buf32[8] = '\0';
                                      buf32[9] = '\0';
                                      buf32[10] = '\0';
                                      buf32[0xb] = '\0';
                                      buf32[0xc] = '\0';
                                      buf32[0xd] = '\0';
                                      buf32[0xe] = '\0';
                                      buf32[0xf] = '\0';
                                      buf32[0x10] = '\0';
                                      buf32[0x11] = '\0';
                                      buf32[0x12] = '\0';
                                      buf32[0x13] = '\0';
                                      buf32[0x14] = '\0';
                                      buf32[0x15] = '\0';
                                      buf32[0x16] = '\0';
                                      buf32[0x17] = '\0';
                                      buf32[0x18] = '\0';
                                      buf32[0x19] = '\0';
                                      buf32[0x1a] = '\0';
                                      buf32[0x1b] = '\0';
                                      buf32[0x1c] = '\0';
                                      buf32[0x1d] = '\0';
                                      buf32[0x1e] = '\0';
                                      buf32[0x1f] = '\0';
                                      (*(CTX->illegal_callback).fn)
                                                ("pubkey != NULL",(CTX->illegal_callback).data);
                                      psVar17 = CTX;
                                      (CTX->illegal_callback).fn =
                                           (_func_void_char_ptr_void_ptr *)xonly_pk_tmp.data._0_8_;
                                      (psVar17->illegal_callback).data =
                                           (void *)xonly_pk_tmp.data._8_8_;
                                      if (_calls_to_callback_3 == 1) {
                                        iVar18 = secp256k1_memcmp_var(buf32,zeros64,0x20);
                                        if (iVar18 == 0) {
                                          xonly_pk_tmp.data[0x30] = '\0';
                                          xonly_pk_tmp.data[0x31] = '\0';
                                          xonly_pk_tmp.data[0x32] = '\0';
                                          xonly_pk_tmp.data[0x33] = '\0';
                                          xonly_pk_tmp.data[0x34] = '\0';
                                          xonly_pk_tmp.data[0x35] = '\0';
                                          xonly_pk_tmp.data[0x36] = '\0';
                                          xonly_pk_tmp.data[0x37] = '\0';
                                          xonly_pk_tmp.data[0x38] = '\0';
                                          xonly_pk_tmp.data[0x39] = '\0';
                                          xonly_pk_tmp.data[0x3a] = '\0';
                                          xonly_pk_tmp.data[0x3b] = '\0';
                                          xonly_pk_tmp.data[0x3c] = '\0';
                                          xonly_pk_tmp.data[0x3d] = '\0';
                                          xonly_pk_tmp.data[0x3e] = '\0';
                                          xonly_pk_tmp.data[0x3f] = '\0';
                                          xonly_pk_tmp.data[0x20] = '\0';
                                          xonly_pk_tmp.data[0x21] = '\0';
                                          xonly_pk_tmp.data[0x22] = '\0';
                                          xonly_pk_tmp.data[0x23] = '\0';
                                          xonly_pk_tmp.data[0x24] = '\0';
                                          xonly_pk_tmp.data[0x25] = '\0';
                                          xonly_pk_tmp.data[0x26] = '\0';
                                          xonly_pk_tmp.data[0x27] = '\0';
                                          xonly_pk_tmp.data[0x28] = '\0';
                                          xonly_pk_tmp.data[0x29] = '\0';
                                          xonly_pk_tmp.data[0x2a] = '\0';
                                          xonly_pk_tmp.data[0x2b] = '\0';
                                          xonly_pk_tmp.data[0x2c] = '\0';
                                          xonly_pk_tmp.data[0x2d] = '\0';
                                          xonly_pk_tmp.data[0x2e] = '\0';
                                          xonly_pk_tmp.data[0x2f] = '\0';
                                          _calls_to_callback_5 = 0;
                                          xonly_pk_tmp.data[0x10] = '\0';
                                          xonly_pk_tmp.data[0x11] = '\0';
                                          xonly_pk_tmp.data[0x12] = '\0';
                                          xonly_pk_tmp.data[0x13] = '\0';
                                          xonly_pk_tmp.data[0x14] = '\0';
                                          xonly_pk_tmp.data[0x15] = '\0';
                                          xonly_pk_tmp.data[0x16] = '\0';
                                          xonly_pk_tmp.data[0x17] = '\0';
                                          xonly_pk_tmp.data[0x18] = '\0';
                                          xonly_pk_tmp.data[0x19] = '\0';
                                          xonly_pk_tmp.data[0x1a] = '\0';
                                          xonly_pk_tmp.data[0x1b] = '\0';
                                          xonly_pk_tmp.data[0x1c] = '\0';
                                          xonly_pk_tmp.data[0x1d] = '\0';
                                          xonly_pk_tmp.data[0x1e] = '\0';
                                          xonly_pk_tmp.data[0x1f] = '\0';
                                          xonly_pk_tmp.data[0] = '\0';
                                          xonly_pk_tmp.data[1] = '\0';
                                          xonly_pk_tmp.data[2] = '\0';
                                          xonly_pk_tmp.data[3] = '\0';
                                          xonly_pk_tmp.data[4] = '\0';
                                          xonly_pk_tmp.data[5] = '\0';
                                          xonly_pk_tmp.data[6] = '\0';
                                          xonly_pk_tmp.data[7] = '\0';
                                          xonly_pk_tmp.data[8] = '\0';
                                          xonly_pk_tmp.data[9] = '\0';
                                          xonly_pk_tmp.data[10] = '\0';
                                          xonly_pk_tmp.data[0xb] = '\0';
                                          xonly_pk_tmp.data[0xc] = '\0';
                                          xonly_pk_tmp.data[0xd] = '\0';
                                          xonly_pk_tmp.data[0xe] = '\0';
                                          xonly_pk_tmp.data[0xf] = '\0';
                                          __calls_to_callback_3 = psVar17->illegal_callback;
                                          secp256k1_context_set_illegal_callback
                                                    (psVar17,counting_callback_fn,
                                                     &_calls_to_callback_5);
                                          iVar18 = secp256k1_xonly_pubkey_serialize
                                                             (CTX,buf32,&xonly_pk_tmp);
                                          psVar17 = CTX;
                                          if (iVar18 == 0) {
                                            (CTX->illegal_callback).fn = __calls_to_callback_3;
                                            (psVar17->illegal_callback).data =
                                                 stack0xfffffffffffff1d0;
                                            if (_calls_to_callback_5 == 1) {
                                              iVar18 = secp256k1_xonly_pubkey_serialize
                                                                 (psVar17,buf32,&xonly_pk);
                                              if (iVar18 == 0) {
                                                pcVar20 = 
                                                "test condition failed: secp256k1_xonly_pubkey_serialize(CTX, buf32, &xonly_pk) == 1"
                                                ;
                                                uStack_e50 = 0x4a;
                                              }
                                              else {
                                                auVar5._12_4_ = 0;
                                                auVar5._0_12_ = _auStack_e34;
                                                __calls_to_callback_3 =
                                                     (secp256k1_callback)(auVar5 << 0x20);
                                                xonly_pk_tmp.data._0_16_ = CTX->illegal_callback;
                                                secp256k1_context_set_illegal_callback
                                                          (CTX,counting_callback_fn,
                                                           &_calls_to_callback_3);
                                                (*(CTX->illegal_callback).fn)
                                                          ("pubkey != NULL",
                                                           (CTX->illegal_callback).data);
                                                psVar17 = CTX;
                                                (CTX->illegal_callback).fn =
                                                     (_func_void_char_ptr_void_ptr *)
                                                     xonly_pk_tmp.data._0_8_;
                                                (psVar17->illegal_callback).data =
                                                     (void *)xonly_pk_tmp.data._8_8_;
                                                if (_calls_to_callback_3 == 1) {
                                                  auVar6._12_4_ = 0;
                                                  auVar6._0_12_ = _auStack_e34;
                                                  __calls_to_callback_3 =
                                                       (secp256k1_callback)(auVar6 << 0x20);
                                                  xonly_pk_tmp.data._0_16_ =
                                                       psVar17->illegal_callback;
                                                  secp256k1_context_set_illegal_callback
                                                            (psVar17,counting_callback_fn,
                                                             &_calls_to_callback_3);
                                                  xonly_pk.data[0] = '\0';
                                                  xonly_pk.data[1] = '\0';
                                                  xonly_pk.data[2] = '\0';
                                                  xonly_pk.data[3] = '\0';
                                                  xonly_pk.data[4] = '\0';
                                                  xonly_pk.data[5] = '\0';
                                                  xonly_pk.data[6] = '\0';
                                                  xonly_pk.data[7] = '\0';
                                                  xonly_pk.data[8] = '\0';
                                                  xonly_pk.data[9] = '\0';
                                                  xonly_pk.data[10] = '\0';
                                                  xonly_pk.data[0xb] = '\0';
                                                  xonly_pk.data[0xc] = '\0';
                                                  xonly_pk.data[0xd] = '\0';
                                                  xonly_pk.data[0xe] = '\0';
                                                  xonly_pk.data[0xf] = '\0';
                                                  xonly_pk.data[0x10] = '\0';
                                                  xonly_pk.data[0x11] = '\0';
                                                  xonly_pk.data[0x12] = '\0';
                                                  xonly_pk.data[0x13] = '\0';
                                                  xonly_pk.data[0x14] = '\0';
                                                  xonly_pk.data[0x15] = '\0';
                                                  xonly_pk.data[0x16] = '\0';
                                                  xonly_pk.data[0x17] = '\0';
                                                  xonly_pk.data[0x18] = '\0';
                                                  xonly_pk.data[0x19] = '\0';
                                                  xonly_pk.data[0x1a] = '\0';
                                                  xonly_pk.data[0x1b] = '\0';
                                                  xonly_pk.data[0x1c] = '\0';
                                                  xonly_pk.data[0x1d] = '\0';
                                                  xonly_pk.data[0x1e] = '\0';
                                                  xonly_pk.data[0x1f] = '\0';
                                                  xonly_pk.data[0x20] = '\0';
                                                  xonly_pk.data[0x21] = '\0';
                                                  xonly_pk.data[0x22] = '\0';
                                                  xonly_pk.data[0x23] = '\0';
                                                  xonly_pk.data[0x24] = '\0';
                                                  xonly_pk.data[0x25] = '\0';
                                                  xonly_pk.data[0x26] = '\0';
                                                  xonly_pk.data[0x27] = '\0';
                                                  xonly_pk.data[0x28] = '\0';
                                                  xonly_pk.data[0x29] = '\0';
                                                  xonly_pk.data[0x2a] = '\0';
                                                  xonly_pk.data[0x2b] = '\0';
                                                  xonly_pk.data[0x2c] = '\0';
                                                  xonly_pk.data[0x2d] = '\0';
                                                  xonly_pk.data[0x2e] = '\0';
                                                  xonly_pk.data[0x2f] = '\0';
                                                  xonly_pk.data[0x30] = '\0';
                                                  xonly_pk.data[0x31] = '\0';
                                                  xonly_pk.data[0x32] = '\0';
                                                  xonly_pk.data[0x33] = '\0';
                                                  xonly_pk.data[0x34] = '\0';
                                                  xonly_pk.data[0x35] = '\0';
                                                  xonly_pk.data[0x36] = '\0';
                                                  xonly_pk.data[0x37] = '\0';
                                                  xonly_pk.data[0x38] = '\0';
                                                  xonly_pk.data[0x39] = '\0';
                                                  xonly_pk.data[0x3a] = '\0';
                                                  xonly_pk.data[0x3b] = '\0';
                                                  xonly_pk.data[0x3c] = '\0';
                                                  xonly_pk.data[0x3d] = '\0';
                                                  xonly_pk.data[0x3e] = '\0';
                                                  xonly_pk.data[0x3f] = '\0';
                                                  (*(CTX->illegal_callback).fn)
                                                            ("input32 != NULL",
                                                             (CTX->illegal_callback).data);
                                                  psVar17 = CTX;
                                                  (CTX->illegal_callback).fn =
                                                       (_func_void_char_ptr_void_ptr *)
                                                       xonly_pk_tmp.data._0_8_;
                                                  (psVar17->illegal_callback).data =
                                                       (void *)xonly_pk_tmp.data._8_8_;
                                                  if (_calls_to_callback_3 == 1) {
                                                    iVar18 = secp256k1_xonly_pubkey_from_pubkey
                                                                       (psVar17,&xonly_pk,(int *)0x0
                                                                        ,&pk);
                                                    if (iVar18 == 0) {
                                                      pcVar20 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_from_pubkey(CTX, &xonly_pk, NULL, &pk) == 1"
                                                  ;
                                                  uStack_e50 = 0x4f;
                                                  }
                                                  else {
                                                    iVar18 = secp256k1_xonly_pubkey_serialize
                                                                       (CTX,buf32,&xonly_pk);
                                                    if (iVar18 == 0) {
                                                      pcVar20 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_serialize(CTX, buf32, &xonly_pk) == 1"
                                                  ;
                                                  uStack_e50 = 0x50;
                                                  }
                                                  else {
                                                    iVar18 = secp256k1_xonly_pubkey_parse
                                                                       (CTX,&xonly_pk_tmp,buf32);
                                                    if (iVar18 == 0) {
                                                      pcVar20 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_parse(CTX, &xonly_pk_tmp, buf32) == 1"
                                                  ;
                                                  uStack_e50 = 0x51;
                                                  }
                                                  else {
                                                    iVar18 = secp256k1_memcmp_var
                                                                       (&xonly_pk,&xonly_pk_tmp,0x40
                                                                       );
                                                    if (iVar18 == 0) {
                                                      builtin_memcpy(xonly_pk.data + 0x30,
                                                                                                                                          
                                                  "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                                                  ,0x10);
                                                  builtin_memcpy(xonly_pk.data + 0x20,
                                                                                                                                  
                                                  "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                                                  ,0x10);
                                                  builtin_memcpy(xonly_pk.data + 0x10,
                                                                                                                                  
                                                  "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                                                  ,0x10);
                                                  builtin_memcpy(xonly_pk.data,
                                                                                                                                  
                                                  "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                                                  ,0x10);
                                                  iVar18 = secp256k1_xonly_pubkey_parse
                                                                     (CTX,&xonly_pk,ones32);
                                                  if (iVar18 == 0) {
                                                    iVar18 = secp256k1_memcmp_var
                                                                       (&xonly_pk,zeros64,0x40);
                                                    if (iVar18 == 0) {
                                                      builtin_memcpy(xonly_pk.data + 0x30,
                                                                                                                                          
                                                  "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                                                  ,0x10);
                                                  builtin_memcpy(xonly_pk.data + 0x20,
                                                                                                                                  
                                                  "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                                                  ,0x10);
                                                  builtin_memcpy(xonly_pk.data + 0x10,
                                                                                                                                  
                                                  "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                                                  ,0x10);
                                                  builtin_memcpy(xonly_pk.data,
                                                                                                                                  
                                                  "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                                                  ,0x10);
                                                  iVar18 = secp256k1_xonly_pubkey_parse
                                                                     (CTX,&xonly_pk,zeros64);
                                                  if (iVar18 == 0) {
                                                    iVar18 = secp256k1_memcmp_var
                                                                       (&xonly_pk,zeros64,0x40);
                                                    if (iVar18 == 0) {
                                                      b32 = (uchar *)((long)&_calls_to_callback_3 +
                                                                     1);
                                                      for (iVar18 = 0; iVar18 < COUNT;
                                                          iVar18 = iVar18 + 1) {
                                                        testrand256(b32);
                                                        _calls_to_callback_3._0_1_ = 2;
                                                        iVar19 = secp256k1_ec_pubkey_parse
                                                                           (CTX,&pk,(uchar *)&
                                                  _calls_to_callback_3,0x21);
                                                  if (iVar19 == 0) {
                                                    builtin_memcpy(xonly_pk.data + 0x30,
                                                                                                                                      
                                                  "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                                                  ,0x10);
                                                  builtin_memcpy(xonly_pk.data + 0x20,
                                                                                                                                  
                                                  "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                                                  ,0x10);
                                                  builtin_memcpy(xonly_pk.data + 0x10,
                                                                                                                                  
                                                  "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                                                  ,0x10);
                                                  builtin_memcpy(xonly_pk.data,
                                                                                                                                  
                                                  "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                                                  ,0x10);
                                                  iVar19 = secp256k1_xonly_pubkey_parse
                                                                     (CTX,&xonly_pk,b32);
                                                  if (iVar19 != 0) {
                                                    pcVar20 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_parse(CTX, &xonly_pk, &rand33[1]) == 0"
                                                  ;
                                                  uStack_e50 = 0x66;
                                                  goto LAB_001243c8;
                                                  }
                                                  iVar19 = secp256k1_memcmp_var
                                                                     (&xonly_pk,zeros64,0x40);
                                                  if (iVar19 != 0) {
                                                    pcVar20 = 
                                                  "test condition failed: secp256k1_memcmp_var(&xonly_pk, zeros64, sizeof(xonly_pk)) == 0"
                                                  ;
                                                  uStack_e50 = 0x67;
                                                  goto LAB_001243c8;
                                                  }
                                                  }
                                                  else {
                                                    iVar19 = secp256k1_xonly_pubkey_parse
                                                                       (CTX,&xonly_pk,b32);
                                                    if (iVar19 == 0) {
                                                      pcVar20 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_parse(CTX, &xonly_pk, &rand33[1]) == 1"
                                                  ;
                                                  uStack_e50 = 0x69;
                                                  goto LAB_001243c8;
                                                  }
                                                  }
                                                  }
                                                  pk1.y.n[1] = 0;
                                                  pk1.y.n[2] = 0;
                                                  pk1.x.n[4] = 0;
                                                  pk1.y.n[0] = 0;
                                                  pk1.x.n[2] = 0;
                                                  pk1.x.n[3] = 0;
                                                  pk1.x.n[0] = 0;
                                                  pk1.x.n[1] = 0;
                                                  xonly_pk_tmp.data[8] = 0xff;
                                                  xonly_pk_tmp.data[9] = 0xff;
                                                  xonly_pk_tmp.data[10] = 0xff;
                                                  xonly_pk_tmp.data[0xb] = 0xff;
                                                  xonly_pk_tmp.data[0] = 0xff;
                                                  xonly_pk_tmp.data[1] = 0xff;
                                                  xonly_pk_tmp.data[2] = 0xff;
                                                  xonly_pk_tmp.data[3] = 0xff;
                                                  xonly_pk_tmp.data[4] = 0xff;
                                                  xonly_pk_tmp.data[5] = 0xff;
                                                  xonly_pk_tmp.data[6] = 0xff;
                                                  xonly_pk_tmp.data[7] = 0xff;
                                                  xonly_pk_tmp.data[0xc] = 0xff;
                                                  xonly_pk_tmp.data[0xd] = 0xff;
                                                  xonly_pk_tmp.data[0xe] = 0xff;
                                                  xonly_pk_tmp.data[0xf] = 0xff;
                                                  xonly_pk_tmp.data[0x18] = 0xff;
                                                  xonly_pk_tmp.data[0x19] = 0xff;
                                                  xonly_pk_tmp.data[0x1a] = 0xff;
                                                  xonly_pk_tmp.data[0x1b] = 0xff;
                                                  xonly_pk_tmp.data[0x10] = 0xff;
                                                  xonly_pk_tmp.data[0x11] = 0xff;
                                                  xonly_pk_tmp.data[0x12] = 0xff;
                                                  xonly_pk_tmp.data[0x13] = 0xff;
                                                  xonly_pk_tmp.data[0x14] = 0xff;
                                                  xonly_pk_tmp.data[0x15] = 0xff;
                                                  xonly_pk_tmp.data[0x16] = 0xff;
                                                  xonly_pk_tmp.data[0x17] = 0xff;
                                                  xonly_pk_tmp.data[0x1c] = 0xff;
                                                  xonly_pk_tmp.data[0x1d] = 0xff;
                                                  xonly_pk_tmp.data[0x1e] = 0xff;
                                                  xonly_pk_tmp.data[0x1f] = 0xff;
                                                  testrand256(tweak);
                                                  testrand256(zeros64);
                                                  iVar18 = secp256k1_ec_pubkey_create
                                                                     (CTX,(secp256k1_pubkey *)&pk2,
                                                                      zeros64);
                                                  if (iVar18 == 0) {
                                                    pcVar20 = 
                                                  "test condition failed: secp256k1_ec_pubkey_create(CTX, &internal_pk, sk) == 1"
                                                  ;
                                                  uStack_e50 = 0x9d;
                                                  }
                                                  else {
                                                    iVar18 = secp256k1_xonly_pubkey_from_pubkey
                                                                       (CTX,(secp256k1_xonly_pubkey
                                                                             *)&pk,(int *)sk,
                                                                        (secp256k1_pubkey *)&pk2);
                                                    if (iVar18 == 0) {
                                                      pcVar20 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_from_pubkey(CTX, &internal_xonly_pk, &pk_parity, &internal_pk) == 1"
                                                  ;
                                                  uStack_e50 = 0x9e;
                                                  }
                                                  else {
                                                    iVar18 = secp256k1_xonly_pubkey_tweak_add
                                                                       (CTX,(secp256k1_pubkey *)
                                                                            &xonly_pk,
                                                                        (secp256k1_xonly_pubkey *)
                                                                        &pk,tweak);
                                                    if (iVar18 == 0) {
                                                      pcVar20 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_tweak_add(CTX, &output_pk, &internal_xonly_pk, tweak) == 1"
                                                  ;
                                                  uStack_e50 = 0xa0;
                                                  }
                                                  else {
                                                    iVar18 = secp256k1_xonly_pubkey_tweak_add
                                                                       (CTX,(secp256k1_pubkey *)
                                                                            &xonly_pk,
                                                                        (secp256k1_xonly_pubkey *)
                                                                        &pk,tweak);
                                                    if (iVar18 == 0) {
                                                      pcVar20 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_tweak_add(CTX, &output_pk, &internal_xonly_pk, tweak) == 1"
                                                  ;
                                                  uStack_e50 = 0xa1;
                                                  }
                                                  else {
                                                    iVar18 = secp256k1_xonly_pubkey_tweak_add
                                                                       (CTX,(secp256k1_pubkey *)
                                                                            &xonly_pk,
                                                                        (secp256k1_xonly_pubkey *)
                                                                        &pk,tweak);
                                                    if (iVar18 == 0) {
                                                      pcVar20 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_tweak_add(CTX, &output_pk, &internal_xonly_pk, tweak) == 1"
                                                  ;
                                                  uStack_e50 = 0xa2;
                                                  }
                                                  else {
                                                    xy_sk._0_8_ = xy_sk._0_8_ & 0xffffffff00000000;
                                                    __calls_to_callback_3 = CTX->illegal_callback;
                                                    secp256k1_context_set_illegal_callback
                                                              (CTX,counting_callback_fn,xy_sk);
                                                    (*(CTX->illegal_callback).fn)
                                                              ("output_pubkey != NULL",
                                                               (CTX->illegal_callback).data);
                                                    psVar17 = CTX;
                                                    (CTX->illegal_callback).fn =
                                                         __calls_to_callback_3;
                                                    (psVar17->illegal_callback).data =
                                                         stack0xfffffffffffff1d0;
                                                    if (xy_sk._0_4_ == 1) {
                                                      xy_sk._0_8_ = xy_sk._0_8_ & 0xffffffff00000000
                                                      ;
                                                      __calls_to_callback_3 =
                                                           psVar17->illegal_callback;
                                                      secp256k1_context_set_illegal_callback
                                                                (psVar17,counting_callback_fn,xy_sk)
                                                      ;
                                                      xonly_pk.data[0] = '\0';
                                                      xonly_pk.data[1] = '\0';
                                                      xonly_pk.data[2] = '\0';
                                                      xonly_pk.data[3] = '\0';
                                                      xonly_pk.data[4] = '\0';
                                                      xonly_pk.data[5] = '\0';
                                                      xonly_pk.data[6] = '\0';
                                                      xonly_pk.data[7] = '\0';
                                                      xonly_pk.data[8] = '\0';
                                                      xonly_pk.data[9] = '\0';
                                                      xonly_pk.data[10] = '\0';
                                                      xonly_pk.data[0xb] = '\0';
                                                      xonly_pk.data[0xc] = '\0';
                                                      xonly_pk.data[0xd] = '\0';
                                                      xonly_pk.data[0xe] = '\0';
                                                      xonly_pk.data[0xf] = '\0';
                                                      xonly_pk.data[0x10] = '\0';
                                                      xonly_pk.data[0x11] = '\0';
                                                      xonly_pk.data[0x12] = '\0';
                                                      xonly_pk.data[0x13] = '\0';
                                                      xonly_pk.data[0x14] = '\0';
                                                      xonly_pk.data[0x15] = '\0';
                                                      xonly_pk.data[0x16] = '\0';
                                                      xonly_pk.data[0x17] = '\0';
                                                      xonly_pk.data[0x18] = '\0';
                                                      xonly_pk.data[0x19] = '\0';
                                                      xonly_pk.data[0x1a] = '\0';
                                                      xonly_pk.data[0x1b] = '\0';
                                                      xonly_pk.data[0x1c] = '\0';
                                                      xonly_pk.data[0x1d] = '\0';
                                                      xonly_pk.data[0x1e] = '\0';
                                                      xonly_pk.data[0x1f] = '\0';
                                                      xonly_pk.data[0x20] = '\0';
                                                      xonly_pk.data[0x21] = '\0';
                                                      xonly_pk.data[0x22] = '\0';
                                                      xonly_pk.data[0x23] = '\0';
                                                      xonly_pk.data[0x24] = '\0';
                                                      xonly_pk.data[0x25] = '\0';
                                                      xonly_pk.data[0x26] = '\0';
                                                      xonly_pk.data[0x27] = '\0';
                                                      xonly_pk.data[0x28] = '\0';
                                                      xonly_pk.data[0x29] = '\0';
                                                      xonly_pk.data[0x2a] = '\0';
                                                      xonly_pk.data[0x2b] = '\0';
                                                      xonly_pk.data[0x2c] = '\0';
                                                      xonly_pk.data[0x2d] = '\0';
                                                      xonly_pk.data[0x2e] = '\0';
                                                      xonly_pk.data[0x2f] = '\0';
                                                      xonly_pk.data[0x30] = '\0';
                                                      xonly_pk.data[0x31] = '\0';
                                                      xonly_pk.data[0x32] = '\0';
                                                      xonly_pk.data[0x33] = '\0';
                                                      xonly_pk.data[0x34] = '\0';
                                                      xonly_pk.data[0x35] = '\0';
                                                      xonly_pk.data[0x36] = '\0';
                                                      xonly_pk.data[0x37] = '\0';
                                                      xonly_pk.data[0x38] = '\0';
                                                      xonly_pk.data[0x39] = '\0';
                                                      xonly_pk.data[0x3a] = '\0';
                                                      xonly_pk.data[0x3b] = '\0';
                                                      xonly_pk.data[0x3c] = '\0';
                                                      xonly_pk.data[0x3d] = '\0';
                                                      xonly_pk.data[0x3e] = '\0';
                                                      xonly_pk.data[0x3f] = '\0';
                                                      (*(CTX->illegal_callback).fn)
                                                                ("internal_pubkey != NULL",
                                                                 (CTX->illegal_callback).data);
                                                      psVar17 = CTX;
                                                      (CTX->illegal_callback).fn =
                                                           __calls_to_callback_3;
                                                      (psVar17->illegal_callback).data =
                                                           stack0xfffffffffffff1d0;
                                                      if (xy_sk._0_4_ == 1) {
                                                        iVar18 = secp256k1_memcmp_var
                                                                           (&xonly_pk,&pk1,0x40);
                                                        if (iVar18 == 0) {
                                                          xy_sk._0_8_ = xy_sk._0_8_ &
                                                                        0xffffffff00000000;
                                                          __calls_to_callback_3 =
                                                               psVar17->illegal_callback;
                                                          secp256k1_context_set_illegal_callback
                                                                    (psVar17,counting_callback_fn,
                                                                     xy_sk);
                                                          xonly_pk.data[0] = '\0';
                                                          xonly_pk.data[1] = '\0';
                                                          xonly_pk.data[2] = '\0';
                                                          xonly_pk.data[3] = '\0';
                                                          xonly_pk.data[4] = '\0';
                                                          xonly_pk.data[5] = '\0';
                                                          xonly_pk.data[6] = '\0';
                                                          xonly_pk.data[7] = '\0';
                                                          xonly_pk.data[8] = '\0';
                                                          xonly_pk.data[9] = '\0';
                                                          xonly_pk.data[10] = '\0';
                                                          xonly_pk.data[0xb] = '\0';
                                                          xonly_pk.data[0xc] = '\0';
                                                          xonly_pk.data[0xd] = '\0';
                                                          xonly_pk.data[0xe] = '\0';
                                                          xonly_pk.data[0xf] = '\0';
                                                          xonly_pk.data[0x10] = '\0';
                                                          xonly_pk.data[0x11] = '\0';
                                                          xonly_pk.data[0x12] = '\0';
                                                          xonly_pk.data[0x13] = '\0';
                                                          xonly_pk.data[0x14] = '\0';
                                                          xonly_pk.data[0x15] = '\0';
                                                          xonly_pk.data[0x16] = '\0';
                                                          xonly_pk.data[0x17] = '\0';
                                                          xonly_pk.data[0x18] = '\0';
                                                          xonly_pk.data[0x19] = '\0';
                                                          xonly_pk.data[0x1a] = '\0';
                                                          xonly_pk.data[0x1b] = '\0';
                                                          xonly_pk.data[0x1c] = '\0';
                                                          xonly_pk.data[0x1d] = '\0';
                                                          xonly_pk.data[0x1e] = '\0';
                                                          xonly_pk.data[0x1f] = '\0';
                                                          xonly_pk.data[0x20] = '\0';
                                                          xonly_pk.data[0x21] = '\0';
                                                          xonly_pk.data[0x22] = '\0';
                                                          xonly_pk.data[0x23] = '\0';
                                                          xonly_pk.data[0x24] = '\0';
                                                          xonly_pk.data[0x25] = '\0';
                                                          xonly_pk.data[0x26] = '\0';
                                                          xonly_pk.data[0x27] = '\0';
                                                          xonly_pk.data[0x28] = '\0';
                                                          xonly_pk.data[0x29] = '\0';
                                                          xonly_pk.data[0x2a] = '\0';
                                                          xonly_pk.data[0x2b] = '\0';
                                                          xonly_pk.data[0x2c] = '\0';
                                                          xonly_pk.data[0x2d] = '\0';
                                                          xonly_pk.data[0x2e] = '\0';
                                                          xonly_pk.data[0x2f] = '\0';
                                                          xonly_pk.data[0x30] = '\0';
                                                          xonly_pk.data[0x31] = '\0';
                                                          xonly_pk.data[0x32] = '\0';
                                                          xonly_pk.data[0x33] = '\0';
                                                          xonly_pk.data[0x34] = '\0';
                                                          xonly_pk.data[0x35] = '\0';
                                                          xonly_pk.data[0x36] = '\0';
                                                          xonly_pk.data[0x37] = '\0';
                                                          xonly_pk.data[0x38] = '\0';
                                                          xonly_pk.data[0x39] = '\0';
                                                          xonly_pk.data[0x3a] = '\0';
                                                          xonly_pk.data[0x3b] = '\0';
                                                          xonly_pk.data[0x3c] = '\0';
                                                          xonly_pk.data[0x3d] = '\0';
                                                          xonly_pk.data[0x3e] = '\0';
                                                          xonly_pk.data[0x3f] = '\0';
                                                          (*(CTX->illegal_callback).fn)
                                                                    ("tweak32 != NULL",
                                                                     (CTX->illegal_callback).data);
                                                          psVar17 = CTX;
                                                          (CTX->illegal_callback).fn =
                                                               __calls_to_callback_3;
                                                          (psVar17->illegal_callback).data =
                                                               stack0xfffffffffffff1d0;
                                                          if (xy_sk._0_4_ == 1) {
                                                            iVar18 = secp256k1_memcmp_var
                                                                               (&xonly_pk,&pk1,0x40)
                                                            ;
                                                            if (iVar18 == 0) {
                                                              iVar18 = 
                                                  secp256k1_xonly_pubkey_tweak_add
                                                            (psVar17,(secp256k1_pubkey *)&xonly_pk,
                                                             (secp256k1_xonly_pubkey *)&pk,
                                                             xonly_pk_tmp.data);
                                                  if (iVar18 == 0) {
                                                    iVar18 = secp256k1_memcmp_var
                                                                       (&xonly_pk,&pk1,0x40);
                                                    if (iVar18 == 0) {
                                                      iVar18 = secp256k1_xonly_pubkey_tweak_add
                                                                         (CTX,(secp256k1_pubkey *)
                                                                              &xonly_pk,
                                                                          (secp256k1_xonly_pubkey *)
                                                                          &pk,(uchar *)&pk1);
                                                      if (iVar18 == 0) {
                                                        pcVar20 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_tweak_add(CTX, &output_pk, &internal_xonly_pk, zeros64) == 1"
                                                  ;
                                                  uStack_e50 = 0xb0;
                                                  }
                                                  else {
                                                    for (iVar18 = 0; iVar18 < COUNT;
                                                        iVar18 = iVar18 + 1) {
                                                      secp256k1_scalar_set_b32
                                                                ((secp256k1_scalar *)
                                                                 &_calls_to_callback_3,zeros64,
                                                                 (int *)0x0);
                                                      secp256k1_scalar_negate
                                                                ((secp256k1_scalar *)
                                                                 &_calls_to_callback_3,
                                                                 (secp256k1_scalar *)
                                                                 &_calls_to_callback_3);
                                                      secp256k1_scalar_get_b32
                                                                (tweak,(secp256k1_scalar *)
                                                                       &_calls_to_callback_3);
                                                      iVar19 = secp256k1_xonly_pubkey_tweak_add
                                                                         (CTX,(secp256k1_pubkey *)
                                                                              &xonly_pk,
                                                                          (secp256k1_xonly_pubkey *)
                                                                          &pk,zeros64);
                                                      if ((iVar19 != 0) &&
                                                         (iVar19 = secp256k1_xonly_pubkey_tweak_add
                                                                             (CTX,(secp256k1_pubkey
                                                                                   *)&xonly_pk,
                                                                              (
                                                  secp256k1_xonly_pubkey *)&pk,tweak), iVar19 != 0))
                                                  {
                                                    pcVar20 = 
                                                  "test condition failed: (secp256k1_xonly_pubkey_tweak_add(CTX, &output_pk, &internal_xonly_pk, sk) == 0) || (secp256k1_xonly_pubkey_tweak_add(CTX, &output_pk, &internal_xonly_pk, tweak) == 0)"
                                                  ;
                                                  uStack_e50 = 0xbb;
                                                  goto LAB_001243c8;
                                                  }
                                                  iVar19 = secp256k1_memcmp_var
                                                                     ((secp256k1_pubkey *)&xonly_pk,
                                                                      &pk1,0x40);
                                                  if (iVar19 != 0) {
                                                    pcVar20 = 
                                                  "test condition failed: secp256k1_memcmp_var(&output_pk, zeros64, sizeof(output_pk)) == 0"
                                                  ;
                                                  uStack_e50 = 0xbc;
                                                  goto LAB_001243c8;
                                                  }
                                                  }
                                                  pk.data[0x30] = '\0';
                                                  pk.data[0x31] = '\0';
                                                  pk.data[0x32] = '\0';
                                                  pk.data[0x33] = '\0';
                                                  pk.data[0x34] = '\0';
                                                  pk.data[0x35] = '\0';
                                                  pk.data[0x36] = '\0';
                                                  pk.data[0x37] = '\0';
                                                  pk.data[0x38] = '\0';
                                                  pk.data[0x39] = '\0';
                                                  pk.data[0x3a] = '\0';
                                                  pk.data[0x3b] = '\0';
                                                  pk.data[0x3c] = '\0';
                                                  pk.data[0x3d] = '\0';
                                                  pk.data[0x3e] = '\0';
                                                  pk.data[0x3f] = '\0';
                                                  pk.data[0x20] = '\0';
                                                  pk.data[0x21] = '\0';
                                                  pk.data[0x22] = '\0';
                                                  pk.data[0x23] = '\0';
                                                  pk.data[0x24] = '\0';
                                                  pk.data[0x25] = '\0';
                                                  pk.data[0x26] = '\0';
                                                  pk.data[0x27] = '\0';
                                                  pk.data[0x28] = '\0';
                                                  pk.data[0x29] = '\0';
                                                  pk.data[0x2a] = '\0';
                                                  pk.data[0x2b] = '\0';
                                                  pk.data[0x2c] = '\0';
                                                  pk.data[0x2d] = '\0';
                                                  pk.data[0x2e] = '\0';
                                                  pk.data[0x2f] = '\0';
                                                  pk.data[0x10] = '\0';
                                                  pk.data[0x11] = '\0';
                                                  pk.data[0x12] = '\0';
                                                  pk.data[0x13] = '\0';
                                                  pk.data[0x14] = '\0';
                                                  pk.data[0x15] = '\0';
                                                  pk.data[0x16] = '\0';
                                                  pk.data[0x17] = '\0';
                                                  pk.data[0x18] = '\0';
                                                  pk.data[0x19] = '\0';
                                                  pk.data[0x1a] = '\0';
                                                  pk.data[0x1b] = '\0';
                                                  pk.data[0x1c] = '\0';
                                                  pk.data[0x1d] = '\0';
                                                  pk.data[0x1e] = '\0';
                                                  pk.data[0x1f] = '\0';
                                                  pk.data[0] = '\0';
                                                  pk.data[1] = '\0';
                                                  pk.data[2] = '\0';
                                                  pk.data[3] = '\0';
                                                  pk.data[4] = '\0';
                                                  pk.data[5] = '\0';
                                                  pk.data[6] = '\0';
                                                  pk.data[7] = '\0';
                                                  pk.data[8] = '\0';
                                                  pk.data[9] = '\0';
                                                  pk.data[10] = '\0';
                                                  pk.data[0xb] = '\0';
                                                  pk.data[0xc] = '\0';
                                                  pk.data[0xd] = '\0';
                                                  pk.data[0xe] = '\0';
                                                  pk.data[0xf] = '\0';
                                                  testrand256(tweak);
                                                  xy_sk._0_8_ = xy_sk._0_8_ & 0xffffffff00000000;
                                                  __calls_to_callback_3 = CTX->illegal_callback;
                                                  secp256k1_context_set_illegal_callback
                                                            (CTX,counting_callback_fn,xy_sk);
                                                  iVar18 = secp256k1_xonly_pubkey_tweak_add
                                                                     (CTX,(secp256k1_pubkey *)
                                                                          &xonly_pk,
                                                                      (secp256k1_xonly_pubkey *)&pk,
                                                                      tweak);
                                                  psVar17 = CTX;
                                                  if (iVar18 == 0) {
                                                    (CTX->illegal_callback).fn =
                                                         __calls_to_callback_3;
                                                    (psVar17->illegal_callback).data =
                                                         stack0xfffffffffffff1d0;
                                                    if (xy_sk._0_4_ == 1) {
                                                      iVar18 = secp256k1_memcmp_var
                                                                         (&xonly_pk,&pk1,0x40);
                                                      if (iVar18 == 0) {
                                                        pk1.y.n[1] = 0;
                                                        pk1.y.n[2] = 0;
                                                        pk1.x.n[4] = 0;
                                                        pk1.y.n[0] = 0;
                                                        pk1.x.n[2] = 0;
                                                        pk1.x.n[3] = 0;
                                                        pk1.x.n[0] = 0;
                                                        pk1.x.n[1] = 0;
                                                        zeros64[8] = 0xff;
                                                        zeros64[9] = 0xff;
                                                        zeros64[10] = 0xff;
                                                        zeros64[0xb] = 0xff;
                                                        zeros64[0] = 0xff;
                                                        zeros64[1] = 0xff;
                                                        zeros64[2] = 0xff;
                                                        zeros64[3] = 0xff;
                                                        zeros64[4] = 0xff;
                                                        zeros64[5] = 0xff;
                                                        zeros64[6] = 0xff;
                                                        zeros64[7] = 0xff;
                                                        zeros64[0xc] = 0xff;
                                                        zeros64[0xd] = 0xff;
                                                        zeros64[0xe] = 0xff;
                                                        zeros64[0xf] = 0xff;
                                                        zeros64[0x18] = 0xff;
                                                        zeros64[0x19] = 0xff;
                                                        zeros64[0x1a] = 0xff;
                                                        zeros64[0x1b] = 0xff;
                                                        zeros64[0x10] = 0xff;
                                                        zeros64[0x11] = 0xff;
                                                        zeros64[0x12] = 0xff;
                                                        zeros64[0x13] = 0xff;
                                                        zeros64[0x14] = 0xff;
                                                        zeros64[0x15] = 0xff;
                                                        zeros64[0x16] = 0xff;
                                                        zeros64[0x17] = 0xff;
                                                        zeros64[0x1c] = 0xff;
                                                        zeros64[0x1d] = 0xff;
                                                        zeros64[0x1e] = 0xff;
                                                        zeros64[0x1f] = 0xff;
                                                        testrand256(xy_sk);
                                                        testrand256(tweak);
                                                        iVar18 = secp256k1_ec_pubkey_create
                                                                           (psVar17,(
                                                  secp256k1_pubkey *)&pk2,tweak);
                                                  if (iVar18 == 0) {
                                                    pcVar20 = 
                                                  "test condition failed: secp256k1_ec_pubkey_create(CTX, &internal_pk, sk) == 1"
                                                  ;
                                                  uStack_e50 = 0xd6;
                                                  }
                                                  else {
                                                    iVar18 = secp256k1_xonly_pubkey_from_pubkey
                                                                       (CTX,(secp256k1_xonly_pubkey
                                                                             *)&pk,(int *)buf32,
                                                                        (secp256k1_pubkey *)&pk2);
                                                    if (iVar18 == 0) {
                                                      pcVar20 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_from_pubkey(CTX, &internal_xonly_pk, &pk_parity, &internal_pk) == 1"
                                                  ;
                                                  uStack_e50 = 0xd7;
                                                  }
                                                  else {
                                                    iVar18 = secp256k1_xonly_pubkey_tweak_add
                                                                       (CTX,(secp256k1_pubkey *)
                                                                            &xonly_pk,
                                                                        (secp256k1_xonly_pubkey *)
                                                                        &pk,xy_sk);
                                                    if (iVar18 == 0) {
                                                      pcVar20 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_tweak_add(CTX, &output_pk, &internal_xonly_pk, tweak) == 1"
                                                  ;
                                                  uStack_e50 = 0xd9;
                                                  }
                                                  else {
                                                    iVar18 = secp256k1_xonly_pubkey_from_pubkey
                                                                       (CTX,&xonly_pk_tmp,
                                                                        (int *)buf32,
                                                                        (secp256k1_pubkey *)
                                                                        &xonly_pk);
                                                    if (iVar18 == 0) {
                                                      pcVar20 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_from_pubkey(CTX, &output_xonly_pk, &pk_parity, &output_pk) == 1"
                                                  ;
                                                  uStack_e50 = 0xda;
                                                  }
                                                  else {
                                                    iVar18 = secp256k1_xonly_pubkey_serialize
                                                                       (CTX,sk,&xonly_pk_tmp);
                                                    if (iVar18 == 0) {
                                                      pcVar20 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_serialize(CTX, buf32, &output_xonly_pk) == 1"
                                                  ;
                                                  uStack_e50 = 0xdb;
                                                  }
                                                  else {
                                                    iVar18 = secp256k1_xonly_pubkey_tweak_add_check
                                                                       (CTX,sk,buf32._0_4_,
                                                                        (secp256k1_xonly_pubkey *)
                                                                        &pk,xy_sk);
                                                    if (iVar18 == 0) {
                                                      pcVar20 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_tweak_add_check(CTX, buf32, pk_parity, &internal_xonly_pk, tweak) == 1"
                                                  ;
                                                  uStack_e50 = 0xdc;
                                                  }
                                                  else {
                                                    iVar18 = secp256k1_xonly_pubkey_tweak_add_check
                                                                       (CTX,sk,buf32._0_4_,
                                                                        (secp256k1_xonly_pubkey *)
                                                                        &pk,xy_sk);
                                                    if (iVar18 == 0) {
                                                      pcVar20 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_tweak_add_check(CTX, buf32, pk_parity, &internal_xonly_pk, tweak) == 1"
                                                  ;
                                                  uStack_e50 = 0xdd;
                                                  }
                                                  else {
                                                    iVar18 = secp256k1_xonly_pubkey_tweak_add_check
                                                                       (CTX,sk,buf32._0_4_,
                                                                        (secp256k1_xonly_pubkey *)
                                                                        &pk,xy_sk);
                                                    if (iVar18 == 0) {
                                                      pcVar20 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_tweak_add_check(CTX, buf32, pk_parity, &internal_xonly_pk, tweak) == 1"
                                                  ;
                                                  uStack_e50 = 0xde;
                                                  }
                                                  else {
                                                    ones32[0] = '\0';
                                                    ones32[1] = '\0';
                                                    ones32[2] = '\0';
                                                    ones32[3] = '\0';
                                                    __calls_to_callback_3 = CTX->illegal_callback;
                                                    secp256k1_context_set_illegal_callback
                                                              (CTX,counting_callback_fn,ones32);
                                                    (*(CTX->illegal_callback).fn)
                                                              ("tweaked_pubkey32 != NULL",
                                                               (CTX->illegal_callback).data);
                                                    psVar17 = CTX;
                                                    (CTX->illegal_callback).fn =
                                                         __calls_to_callback_3;
                                                    (psVar17->illegal_callback).data =
                                                         stack0xfffffffffffff1d0;
                                                    if (ones32._0_4_ == 1) {
                                                      iVar18 = 
                                                  secp256k1_xonly_pubkey_tweak_add_check
                                                            (psVar17,sk,2,
                                                             (secp256k1_xonly_pubkey *)&pk,xy_sk);
                                                  if (iVar18 == 0) {
                                                    ones32[0] = '\0';
                                                    ones32[1] = '\0';
                                                    ones32[2] = '\0';
                                                    ones32[3] = '\0';
                                                    __calls_to_callback_3 = CTX->illegal_callback;
                                                    secp256k1_context_set_illegal_callback
                                                              (CTX,counting_callback_fn,ones32);
                                                    (*(CTX->illegal_callback).fn)
                                                              ("internal_pubkey != NULL",
                                                               (CTX->illegal_callback).data);
                                                    psVar17 = CTX;
                                                    (CTX->illegal_callback).fn =
                                                         __calls_to_callback_3;
                                                    (psVar17->illegal_callback).data =
                                                         stack0xfffffffffffff1d0;
                                                    if (ones32._0_4_ == 1) {
                                                      ones32[0] = '\0';
                                                      ones32[1] = '\0';
                                                      ones32[2] = '\0';
                                                      ones32[3] = '\0';
                                                      __calls_to_callback_3 =
                                                           psVar17->illegal_callback;
                                                      secp256k1_context_set_illegal_callback
                                                                (psVar17,counting_callback_fn,ones32
                                                                );
                                                      (*(CTX->illegal_callback).fn)
                                                                ("tweak32 != NULL",
                                                                 (CTX->illegal_callback).data);
                                                      psVar17 = CTX;
                                                      (CTX->illegal_callback).fn =
                                                           __calls_to_callback_3;
                                                      (psVar17->illegal_callback).data =
                                                           stack0xfffffffffffff1d0;
                                                      if (ones32._0_4_ == 1) {
                                                        builtin_memcpy(xy_sk,
                                                  "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                                                  ,0x20);
                                                  pubkey = &pk2;
                                                  iVar18 = secp256k1_xonly_pubkey_from_pubkey
                                                                     (psVar17,(
                                                  secp256k1_xonly_pubkey *)&pk,(int *)0x0,
                                                  (secp256k1_pubkey *)pubkey);
                                                  if (iVar18 == 0) {
                                                    pcVar20 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_from_pubkey(CTX, &internal_xonly_pk, NULL, &internal_pk) == 1"
                                                  ;
                                                  uStack_e50 = 0xe6;
                                                  }
                                                  else {
                                                    iVar18 = secp256k1_xonly_pubkey_tweak_add
                                                                       (CTX,(secp256k1_pubkey *)
                                                                            &xonly_pk,
                                                                        (secp256k1_xonly_pubkey *)
                                                                        &pk,xy_sk);
                                                    if (iVar18 == 0) {
                                                      pcVar20 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_tweak_add(CTX, &output_pk, &internal_xonly_pk, tweak) == 1"
                                                  ;
                                                  uStack_e50 = 0xe7;
                                                  }
                                                  else {
                                                    iVar18 = secp256k1_xonly_pubkey_from_pubkey
                                                                       (CTX,&xonly_pk_tmp,
                                                                        (int *)buf32,
                                                                        (secp256k1_pubkey *)
                                                                        &xonly_pk);
                                                    if (iVar18 == 0) {
                                                      pcVar20 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_from_pubkey(CTX, &output_xonly_pk, &pk_parity, &output_pk) == 1"
                                                  ;
                                                  uStack_e50 = 0xe8;
                                                  }
                                                  else {
                                                    iVar18 = secp256k1_xonly_pubkey_serialize
                                                                       (CTX,(uchar *)&
                                                  _calls_to_callback_3,&xonly_pk_tmp);
                                                  if (iVar18 == 0) {
                                                    pcVar20 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_serialize(CTX, output_pk32, &output_xonly_pk) == 1"
                                                  ;
                                                  uStack_e50 = 0xe9;
                                                  }
                                                  else {
                                                    iVar18 = secp256k1_xonly_pubkey_tweak_add_check
                                                                       (CTX,(uchar *)&
                                                  _calls_to_callback_3,buf32._0_4_,
                                                  (secp256k1_xonly_pubkey *)&pk,xy_sk);
                                                  if (iVar18 == 0) {
                                                    pcVar20 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_tweak_add_check(CTX, output_pk32, pk_parity, &internal_xonly_pk, tweak) == 1"
                                                  ;
                                                  uStack_e50 = 0xea;
                                                  }
                                                  else {
                                                    iVar18 = secp256k1_xonly_pubkey_tweak_add_check
                                                                       (CTX,(uchar *)&
                                                  _calls_to_callback_3,(uint)(buf32._0_4_ == 0),
                                                  (secp256k1_xonly_pubkey *)&pk,xy_sk);
                                                  if (iVar18 == 0) {
                                                    iVar18 = secp256k1_xonly_pubkey_serialize
                                                                       (CTX,sk,(
                                                  secp256k1_xonly_pubkey *)&pk);
                                                  if (iVar18 == 0) {
                                                    pcVar20 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_serialize(CTX, buf32, &internal_xonly_pk) == 1"
                                                  ;
                                                  uStack_e50 = 0xef;
                                                  }
                                                  else {
                                                    iVar18 = secp256k1_xonly_pubkey_tweak_add_check
                                                                       (CTX,sk,buf32._0_4_,
                                                                        (secp256k1_xonly_pubkey *)
                                                                        &pk,xy_sk);
                                                    if (iVar18 == 0) {
                                                      iVar18 = 
                                                  secp256k1_xonly_pubkey_tweak_add_check
                                                            (CTX,(uchar *)&_calls_to_callback_3,
                                                             buf32._0_4_,
                                                             (secp256k1_xonly_pubkey *)&pk,zeros64);
                                                  if (iVar18 == 0) {
                                                    iVar18 = secp256k1_xonly_pubkey_tweak_add
                                                                       (CTX,(secp256k1_pubkey *)
                                                                            &xonly_pk,
                                                                        (secp256k1_xonly_pubkey *)
                                                                        &pk,zeros64);
                                                    if (iVar18 == 0) {
                                                      iVar18 = secp256k1_memcmp_var
                                                                         (&xonly_pk,&pk1,0x40);
                                                      if (iVar18 == 0) {
                                                        testrand256(xonly_pk.data);
                                                        pubkey_01 = &pk1;
                                                        iVar18 = secp256k1_ec_pubkey_create
                                                                           (CTX,(secp256k1_pubkey *)
                                                                                pubkey_01,
                                                                            xonly_pk.data);
                                                        if (iVar18 == 0) {
                                                          pcVar20 = 
                                                  "test condition failed: secp256k1_ec_pubkey_create(CTX, &pk[0], sk) == 1"
                                                  ;
                                                  uStack_e50 = 0x104;
                                                  }
                                                  else {
                                                    for (lVar21 = -0x1f; lVar21 != 0;
                                                        lVar21 = lVar21 + 1) {
                                                      cVar22 = (char)lVar21 + ' ';
                                                      auVar24 = ZEXT216(CONCAT11(cVar22,cVar22));
                                                      auVar24 = pshuflw(auVar24,auVar24,0);
                                                      uVar23 = auVar24._0_4_;
                                                      *(undefined4 *)((pubkey->x).n + 2) = uVar23;
                                                      *(undefined4 *)((long)(pubkey->x).n + 0x14) =
                                                           uVar23;
                                                      *(undefined4 *)((pubkey->x).n + 3) = uVar23;
                                                      *(undefined4 *)((long)(pubkey->x).n + 0x1c) =
                                                           uVar23;
                                                      *(undefined4 *)(pubkey->x).n = uVar23;
                                                      *(undefined4 *)((long)(pubkey->x).n + 4) =
                                                           uVar23;
                                                      *(undefined4 *)((pubkey->x).n + 1) = uVar23;
                                                      *(undefined4 *)((long)(pubkey->x).n + 0xc) =
                                                           uVar23;
                                                      iVar18 = secp256k1_xonly_pubkey_from_pubkey
                                                                         (CTX,(
                                                  secp256k1_xonly_pubkey *)&pk,(int *)0x0,
                                                  (secp256k1_pubkey *)pubkey_01);
                                                  if (iVar18 == 0) {
                                                    pcVar20 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_from_pubkey(CTX, &xonly_pk, NULL, &pk[i]) == 1"
                                                  ;
                                                  uStack_e50 = 0x109;
                                                  goto LAB_001243c8;
                                                  }
                                                  pubkey_01 = (secp256k1_ge *)((pubkey_01->y).n + 3)
                                                  ;
                                                  iVar18 = secp256k1_xonly_pubkey_tweak_add
                                                                     (CTX,(secp256k1_pubkey *)
                                                                          pubkey_01,
                                                                      (secp256k1_xonly_pubkey *)&pk,
                                                                      (uchar *)pubkey);
                                                  if (iVar18 == 0) {
                                                    pcVar20 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_tweak_add(CTX, &pk[i + 1], &xonly_pk, tweak[i]) == 1"
                                                  ;
                                                  uStack_e50 = 0x10a;
                                                  goto LAB_001243c8;
                                                  }
                                                  pubkey = (secp256k1_ge *)((pubkey->x).n + 4);
                                                  }
                                                  pubkey_00 = local_b8;
                                                  for (lVar21 = 0x3c0; lVar21 != -0x20;
                                                      lVar21 = lVar21 + -0x20) {
                                                    iVar18 = secp256k1_xonly_pubkey_from_pubkey
                                                                       (CTX,(secp256k1_xonly_pubkey
                                                                             *)&pk,(int *)zeros64,
                                                                        pubkey_00 + 1);
                                                    if (iVar18 == 0) {
                                                      pcVar20 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_from_pubkey(CTX, &xonly_pk, &pk_parity, &pk[i]) == 1"
                                                  ;
                                                  uStack_e50 = 0x111;
                                                  goto LAB_001243c8;
                                                  }
                                                  iVar18 = secp256k1_xonly_pubkey_serialize
                                                                     (CTX,xonly_pk_tmp.data,
                                                                      (secp256k1_xonly_pubkey *)&pk)
                                                  ;
                                                  if (iVar18 == 0) {
                                                    pcVar20 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_serialize(CTX, pk_serialized, &xonly_pk) == 1"
                                                  ;
                                                  uStack_e50 = 0x112;
                                                  goto LAB_001243c8;
                                                  }
                                                  iVar18 = secp256k1_xonly_pubkey_from_pubkey
                                                                     (CTX,(secp256k1_xonly_pubkey *)
                                                                          &pk,(int *)0x0,pubkey_00);
                                                  if (iVar18 == 0) {
                                                    pcVar20 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_from_pubkey(CTX, &xonly_pk, NULL, &pk[i - 1]) == 1"
                                                  ;
                                                  uStack_e50 = 0x113;
                                                  goto LAB_001243c8;
                                                  }
                                                  iVar18 = secp256k1_xonly_pubkey_tweak_add_check
                                                                     (CTX,xonly_pk_tmp.data,
                                                                      zeros64._0_4_,
                                                                      (secp256k1_xonly_pubkey *)&pk,
                                                                      (uchar *)((long)pk2.x.n +
                                                                               lVar21));
                                                  if (iVar18 == 0) {
                                                    pcVar20 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_tweak_add_check(CTX, pk_serialized, pk_parity, &xonly_pk, tweak[i - 1]) == 1"
                                                  ;
                                                  uStack_e50 = 0x114;
                                                  goto LAB_001243c8;
                                                  }
                                                  pubkey_00 = pubkey_00 + -1;
                                                  }
                                                  pk.data[0x18] = 0x80;
                                                  pk.data[0x19] = '&';
                                                  pk.data[0x1a] = '\x11';
                                                  pk.data[0x1b] = 0xef;
                                                  pk.data[0x1c] = 'g';
                                                  pk.data[0x1d] = 'K';
                                                  pk.data[0x1e] = 0xd9;
                                                  pk.data[0x1f] = '#';
                                                  pk.data[0x10] = 0xd0;
                                                  pk.data[0x11] = 0x9a;
                                                  pk.data[0x12] = 0xa1;
                                                  pk.data[0x13] = '\x1b';
                                                  pk.data[0x14] = 0x80;
                                                  pk.data[0x15] = '\v';
                                                  pk.data[0x16] = '^';
                                                  pk.data[0x17] = 0x93;
                                                  pk.data[8] = 0x92;
                                                  pk.data[9] = '8';
                                                  pk.data[10] = 0xa6;
                                                  pk.data[0xb] = '&';
                                                  pk.data[0xc] = 'b';
                                                  pk.data[0xd] = 'R';
                                                  pk.data[0xe] = '5';
                                                  pk.data[0xf] = '\x11';
                                                  pk.data[0] = 'X';
                                                  pk.data[1] = 0x84;
                                                  pk.data[2] = 0xb3;
                                                  pk.data[3] = 0xa2;
                                                  pk.data[4] = 'K';
                                                  pk.data[5] = 0x97;
                                                  pk.data[6] = '7';
                                                  pk.data[7] = 0x88;
                                                  xonly_pk.data[0x10] = 0xb2;
                                                  xonly_pk.data[0x11] = 0xc2;
                                                  xonly_pk.data[0x12] = 0xd5;
                                                  xonly_pk.data[0x13] = '\x03';
                                                  xonly_pk.data[0x14] = 0xa7;
                                                  xonly_pk.data[0x15] = 0xf9;
                                                  xonly_pk.data[0x16] = 0xf1;
                                                  xonly_pk.data[0x17] = 'O';
                                                  xonly_pk.data[0x18] = 0xa8;
                                                  xonly_pk.data[0x19] = 0xfa;
                                                  xonly_pk.data[0x1a] = 0x95;
                                                  xonly_pk.data[0x1b] = 0xa8;
                                                  xonly_pk.data[0x1c] = 0xe9;
                                                  xonly_pk.data[0x1d] = 'i';
                                                  xonly_pk.data[0x1e] = 'v';
                                                  xonly_pk.data[0x1f] = '\x1c';
                                                  xonly_pk.data[0] = 0xde;
                                                  xonly_pk.data[1] = '6';
                                                  xonly_pk.data[2] = '\x0e';
                                                  xonly_pk.data[3] = 0x87;
                                                  xonly_pk.data[4] = 'Y';
                                                  xonly_pk.data[5] = 0x8f;
                                                  xonly_pk.data[6] = '<';
                                                  xonly_pk.data[7] = '\x01';
                                                  xonly_pk.data[8] = '6';
                                                  xonly_pk.data[9] = '*';
                                                  xonly_pk.data[10] = '*';
                                                  xonly_pk.data[0xb] = 0xb8;
                                                  xonly_pk.data[0xc] = 0xc6;
                                                  xonly_pk.data[0xd] = 0xf4;
                                                  xonly_pk.data[0xe] = '^';
                                                  xonly_pk.data[0xf] = 'M';
                                                  iVar18 = secp256k1_xonly_pubkey_parse
                                                                     (CTX,(secp256k1_xonly_pubkey *)
                                                                          &pk1,pk.data);
                                                  if (iVar18 == 0) {
                                                    pcVar20 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_parse(CTX, &pk1, pk1_ser) == 1"
                                                  ;
                                                  uStack_e50 = 0x7a;
                                                  }
                                                  else {
                                                    iVar18 = secp256k1_xonly_pubkey_parse
                                                                       (CTX,(secp256k1_xonly_pubkey
                                                                             *)&pk2,xonly_pk.data);
                                                    if (iVar18 == 0) {
                                                      pcVar20 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_parse(CTX, &pk2, pk2_ser) == 1"
                                                  ;
                                                  uStack_e50 = 0x7b;
                                                  }
                                                  else {
                                                    auVar7._12_4_ = 0;
                                                    auVar7[0] = zeros64[4];
                                                    auVar7[1] = zeros64[5];
                                                    auVar7[2] = zeros64[6];
                                                    auVar7[3] = zeros64[7];
                                                    auVar7[4] = zeros64[8];
                                                    auVar7[5] = zeros64[9];
                                                    auVar7[6] = zeros64[10];
                                                    auVar7[7] = zeros64[0xb];
                                                    auVar7[8] = zeros64[0xc];
                                                    auVar7[9] = zeros64[0xd];
                                                    auVar7[10] = zeros64[0xe];
                                                    auVar7[0xb] = zeros64[0xf];
                                                    zeros64._0_16_ = auVar7 << 0x20;
                                                    xonly_pk_tmp.data._0_16_ = CTX->illegal_callback
                                                    ;
                                                    secp256k1_context_set_illegal_callback
                                                              (CTX,counting_callback_fn,zeros64);
                                                    iVar18 = secp256k1_xonly_pubkey_cmp
                                                                       (CTX,(secp256k1_xonly_pubkey
                                                                             *)0x0,
                                                                        (secp256k1_xonly_pubkey *)
                                                                        &pk2);
                                                    psVar17 = CTX;
                                                    if (iVar18 < 0) {
                                                      (CTX->illegal_callback).fn =
                                                           (_func_void_char_ptr_void_ptr *)
                                                           xonly_pk_tmp.data._0_8_;
                                                      (psVar17->illegal_callback).data =
                                                           (void *)xonly_pk_tmp.data._8_8_;
                                                      if (zeros64._0_4_ == 1) {
                                                        auVar8._12_4_ = 0;
                                                        auVar8[0] = zeros64[4];
                                                        auVar8[1] = zeros64[5];
                                                        auVar8[2] = zeros64[6];
                                                        auVar8[3] = zeros64[7];
                                                        auVar8[4] = zeros64[8];
                                                        auVar8[5] = zeros64[9];
                                                        auVar8[6] = zeros64[10];
                                                        auVar8[7] = zeros64[0xb];
                                                        auVar8[8] = zeros64[0xc];
                                                        auVar8[9] = zeros64[0xd];
                                                        auVar8[10] = zeros64[0xe];
                                                        auVar8[0xb] = zeros64[0xf];
                                                        zeros64._0_16_ = auVar8 << 0x20;
                                                        xonly_pk_tmp.data._0_16_ =
                                                             psVar17->illegal_callback;
                                                        secp256k1_context_set_illegal_callback
                                                                  (psVar17,counting_callback_fn,
                                                                   zeros64);
                                                        iVar18 = secp256k1_xonly_pubkey_cmp
                                                                           (CTX,(
                                                  secp256k1_xonly_pubkey *)&pk1,
                                                  (secp256k1_xonly_pubkey *)0x0);
                                                  psVar17 = CTX;
                                                  if (iVar18 < 1) {
                                                    pcVar20 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_cmp(CTX, &pk1, NULL) > 0"
                                                  ;
                                                  }
                                                  else {
                                                    (CTX->illegal_callback).fn =
                                                         (_func_void_char_ptr_void_ptr *)
                                                         xonly_pk_tmp.data._0_8_;
                                                    (psVar17->illegal_callback).data =
                                                         (void *)xonly_pk_tmp.data._8_8_;
                                                    if (zeros64._0_4_ == 1) {
                                                      iVar18 = secp256k1_xonly_pubkey_cmp
                                                                         (psVar17,(
                                                  secp256k1_xonly_pubkey *)&pk1,
                                                  (secp256k1_xonly_pubkey *)&pk2);
                                                  if (iVar18 < 0) {
                                                    iVar18 = secp256k1_xonly_pubkey_cmp
                                                                       (CTX,(secp256k1_xonly_pubkey
                                                                             *)&pk2,
                                                                        (secp256k1_xonly_pubkey *)
                                                                        &pk1);
                                                    if (iVar18 < 1) {
                                                      pcVar20 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_cmp(CTX, &pk2, &pk1) > 0"
                                                  ;
                                                  uStack_e50 = 0x80;
                                                  }
                                                  else {
                                                    iVar18 = secp256k1_xonly_pubkey_cmp
                                                                       (CTX,(secp256k1_xonly_pubkey
                                                                             *)&pk1,
                                                                        (secp256k1_xonly_pubkey *)
                                                                        &pk1);
                                                    if (iVar18 == 0) {
                                                      iVar18 = secp256k1_xonly_pubkey_cmp
                                                                         (CTX,(
                                                  secp256k1_xonly_pubkey *)&pk2,
                                                  (secp256k1_xonly_pubkey *)&pk2);
                                                  if (iVar18 == 0) {
                                                    pk1.y.n._8_16_ = ZEXT816(0);
                                                    pk1._32_16_ = ZEXT816(0);
                                                    pk1.x.n._16_16_ = ZEXT816(0);
                                                    auVar9._12_4_ = 0;
                                                    auVar9[0] = zeros64[4];
                                                    auVar9[1] = zeros64[5];
                                                    auVar9[2] = zeros64[6];
                                                    auVar9[3] = zeros64[7];
                                                    auVar9[4] = zeros64[8];
                                                    auVar9[5] = zeros64[9];
                                                    auVar9[6] = zeros64[10];
                                                    auVar9[7] = zeros64[0xb];
                                                    auVar9[8] = zeros64[0xc];
                                                    auVar9[9] = zeros64[0xd];
                                                    auVar9[10] = zeros64[0xe];
                                                    auVar9[0xb] = zeros64[0xf];
                                                    zeros64._0_16_ = auVar9 << 0x20;
                                                    pk1.x.n._0_16_ = ZEXT816(0);
                                                    xonly_pk_tmp.data._0_16_ = CTX->illegal_callback
                                                    ;
                                                    secp256k1_context_set_illegal_callback
                                                              (CTX,counting_callback_fn,zeros64);
                                                    iVar18 = secp256k1_xonly_pubkey_cmp
                                                                       (CTX,(secp256k1_xonly_pubkey
                                                                             *)&pk1,
                                                                        (secp256k1_xonly_pubkey *)
                                                                        &pk2);
                                                    psVar17 = CTX;
                                                    if (iVar18 < 0) {
                                                      (CTX->illegal_callback).fn =
                                                           (_func_void_char_ptr_void_ptr *)
                                                           xonly_pk_tmp.data._0_8_;
                                                      (psVar17->illegal_callback).data =
                                                           (void *)xonly_pk_tmp.data._8_8_;
                                                      if (zeros64._0_4_ == 1) {
                                                        auVar10._12_4_ = 0;
                                                        auVar10[0] = xonly_pk_tmp.data[4];
                                                        auVar10[1] = xonly_pk_tmp.data[5];
                                                        auVar10[2] = xonly_pk_tmp.data[6];
                                                        auVar10[3] = xonly_pk_tmp.data[7];
                                                        auVar10[4] = xonly_pk_tmp.data[8];
                                                        auVar10[5] = xonly_pk_tmp.data[9];
                                                        auVar10[6] = xonly_pk_tmp.data[10];
                                                        auVar10[7] = xonly_pk_tmp.data[0xb];
                                                        auVar10[8] = xonly_pk_tmp.data[0xc];
                                                        auVar10[9] = xonly_pk_tmp.data[0xd];
                                                        auVar10[10] = xonly_pk_tmp.data[0xe];
                                                        auVar10[0xb] = xonly_pk_tmp.data[0xf];
                                                        xonly_pk_tmp.data._0_16_ = auVar10 << 0x20;
                                                        secp256k1_context_set_illegal_callback
                                                                  (psVar17,counting_callback_fn,
                                                                   &xonly_pk_tmp);
                                                        iVar18 = secp256k1_xonly_pubkey_cmp
                                                                           (CTX,(
                                                  secp256k1_xonly_pubkey *)&pk1,
                                                  (secp256k1_xonly_pubkey *)&pk1);
                                                  if (iVar18 == 0) {
                                                    if (xonly_pk_tmp.data._0_4_ == 2) {
                                                      secp256k1_context_set_illegal_callback
                                                                (CTX,(_func_void_char_ptr_void_ptr *
                                                                     )0x0,(void *)0x0);
                                                      auVar11._12_4_ = 0;
                                                      auVar11[0] = zeros64[4];
                                                      auVar11[1] = zeros64[5];
                                                      auVar11[2] = zeros64[6];
                                                      auVar11[3] = zeros64[7];
                                                      auVar11[4] = zeros64[8];
                                                      auVar11[5] = zeros64[9];
                                                      auVar11[6] = zeros64[10];
                                                      auVar11[7] = zeros64[0xb];
                                                      auVar11[8] = zeros64[0xc];
                                                      auVar11[9] = zeros64[0xd];
                                                      auVar11[10] = zeros64[0xe];
                                                      auVar11[0xb] = zeros64[0xf];
                                                      zeros64._0_16_ = auVar11 << 0x20;
                                                      xonly_pk_tmp.data._0_16_ =
                                                           CTX->illegal_callback;
                                                      secp256k1_context_set_illegal_callback
                                                                (CTX,counting_callback_fn,zeros64);
                                                      iVar18 = secp256k1_xonly_pubkey_cmp
                                                                         (CTX,(
                                                  secp256k1_xonly_pubkey *)&pk2,
                                                  (secp256k1_xonly_pubkey *)&pk1);
                                                  psVar17 = CTX;
                                                  if (iVar18 < 1) {
                                                    pcVar20 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_cmp(CTX, &pk2, &pk1) > 0"
                                                  ;
                                                  }
                                                  else {
                                                    (CTX->illegal_callback).fn =
                                                         (_func_void_char_ptr_void_ptr *)
                                                         xonly_pk_tmp.data._0_8_;
                                                    (psVar17->illegal_callback).data =
                                                         (void *)xonly_pk_tmp.data._8_8_;
                                                    if (zeros64._0_4_ == 1) {
                                                      stack0xfffffffffffff818 =
                                                           (undefined1  [16])0x0;
                                                      pk1.y.n[3] = 0;
                                                      pk1.y.n[4] = 0;
                                                      pk1.y.n[1] = 0;
                                                      pk1.y.n[2] = 0;
                                                      pk1.x.n[4] = 0;
                                                      pk1.y.n[0] = 0;
                                                      pk1.x.n[2] = 0;
                                                      pk1.x.n[3] = 0;
                                                      pk1.x.n[0] = 0;
                                                      pk1.x.n[1] = 0;
                                                      sk[8] = 0xff;
                                                      sk[9] = 0xff;
                                                      sk[10] = 0xff;
                                                      sk[0xb] = 0xff;
                                                      sk[0] = 0xff;
                                                      sk[1] = 0xff;
                                                      sk[2] = 0xff;
                                                      sk[3] = 0xff;
                                                      sk[4] = 0xff;
                                                      sk[5] = 0xff;
                                                      sk[6] = 0xff;
                                                      sk[7] = 0xff;
                                                      sk[0xc] = 0xff;
                                                      sk[0xd] = 0xff;
                                                      sk[0xe] = 0xff;
                                                      sk[0xf] = 0xff;
                                                      sk[0x18] = 0xff;
                                                      sk[0x19] = 0xff;
                                                      sk[0x1a] = 0xff;
                                                      sk[0x1b] = 0xff;
                                                      sk[0x10] = 0xff;
                                                      sk[0x11] = 0xff;
                                                      sk[0x12] = 0xff;
                                                      sk[0x13] = 0xff;
                                                      sk[0x14] = 0xff;
                                                      sk[0x15] = 0xff;
                                                      sk[0x16] = 0xff;
                                                      sk[0x17] = 0xff;
                                                      sk[0x1c] = 0xff;
                                                      sk[0x1d] = 0xff;
                                                      sk[0x1e] = 0xff;
                                                      sk[0x1f] = 0xff;
                                                      testrand256(tweak);
                                                      iVar18 = secp256k1_keypair_create
                                                                         (psVar17,(secp256k1_keypair
                                                                                   *)&pk2,tweak);
                                                      if (iVar18 == 0) {
                                                        pcVar20 = 
                                                  "test condition failed: secp256k1_keypair_create(CTX, &keypair, sk) == 1"
                                                  ;
                                                  uStack_e50 = 0x128;
                                                  }
                                                  else {
                                                    iVar18 = secp256k1_memcmp_var(&pk1,&pk2,0x60);
                                                    if (iVar18 == 0) {
                                                      pcVar20 = 
                                                  "test condition failed: secp256k1_memcmp_var(zeros96, &keypair, sizeof(keypair)) != 0"
                                                  ;
                                                  uStack_e50 = 0x129;
                                                  }
                                                  else {
                                                    iVar18 = secp256k1_keypair_create
                                                                       (CTX,(secp256k1_keypair *)
                                                                            &pk2,tweak);
                                                    if (iVar18 == 0) {
                                                      pcVar20 = 
                                                  "test condition failed: secp256k1_keypair_create(CTX, &keypair, sk) == 1"
                                                  ;
                                                  uStack_e50 = 0x12a;
                                                  }
                                                  else {
                                                    iVar18 = secp256k1_memcmp_var(&pk1,&pk2,0x60);
                                                    if (iVar18 == 0) {
                                                      pcVar20 = 
                                                  "test condition failed: secp256k1_memcmp_var(zeros96, &keypair, sizeof(keypair)) != 0"
                                                  ;
                                                  uStack_e50 = 299;
                                                  }
                                                  else {
                                                    xonly_pk.data._0_8_ =
                                                         xonly_pk.data._0_8_ & 0xffffffff00000000;
                                                    pk.data._0_16_ = CTX->illegal_callback;
                                                    secp256k1_context_set_illegal_callback
                                                              (CTX,counting_callback_fn,&xonly_pk);
                                                    (*(CTX->illegal_callback).fn)
                                                              ("keypair != NULL",
                                                               (CTX->illegal_callback).data);
                                                    psVar17 = CTX;
                                                    (CTX->illegal_callback).fn =
                                                         (_func_void_char_ptr_void_ptr *)
                                                         pk.data._0_8_;
                                                    (psVar17->illegal_callback).data =
                                                         (void *)pk.data._8_8_;
                                                    if (xonly_pk.data._0_4_ == 1) {
                                                      xonly_pk.data._0_8_ =
                                                           xonly_pk.data._0_8_ & 0xffffffff00000000;
                                                      pk.data._0_16_ = psVar17->illegal_callback;
                                                      secp256k1_context_set_illegal_callback
                                                                (psVar17,counting_callback_fn,
                                                                 &xonly_pk);
                                                      iVar18 = secp256k1_keypair_create
                                                                         (CTX,(secp256k1_keypair *)
                                                                              &pk2,(uchar *)0x0);
                                                      psVar17 = CTX;
                                                      if (iVar18 == 0) {
                                                        (CTX->illegal_callback).fn =
                                                             (_func_void_char_ptr_void_ptr *)
                                                             pk.data._0_8_;
                                                        (psVar17->illegal_callback).data =
                                                             (void *)pk.data._8_8_;
                                                        if (xonly_pk.data._0_4_ == 1) {
                                                          iVar18 = secp256k1_memcmp_var
                                                                             (&pk1,&pk2,0x60);
                                                          if (iVar18 == 0) {
                                                            iVar18 = secp256k1_keypair_create
                                                                               (psVar17,(
                                                  secp256k1_keypair *)&pk2,tweak);
                                                  if (iVar18 == 0) {
                                                    pcVar20 = 
                                                  "test condition failed: secp256k1_keypair_create(CTX, &keypair, sk) == 1"
                                                  ;
                                                  uStack_e50 = 0x12f;
                                                  }
                                                  else {
                                                    xonly_pk.data._0_8_ =
                                                         xonly_pk.data._0_8_ & 0xffffffff00000000;
                                                    pk.data._0_16_ = STATIC_CTX->illegal_callback;
                                                    secp256k1_context_set_illegal_callback
                                                              (STATIC_CTX,counting_callback_fn,
                                                               &xonly_pk);
                                                    iVar18 = secp256k1_keypair_create
                                                                       (STATIC_CTX,
                                                                        (secp256k1_keypair *)&pk2,
                                                                        tweak);
                                                    psVar17 = STATIC_CTX;
                                                    if (iVar18 == 0) {
                                                      (STATIC_CTX->illegal_callback).fn =
                                                           (_func_void_char_ptr_void_ptr *)
                                                           pk.data._0_8_;
                                                      (psVar17->illegal_callback).data =
                                                           (void *)pk.data._8_8_;
                                                      if (xonly_pk.data._0_4_ == 1) {
                                                        iVar18 = secp256k1_memcmp_var
                                                                           (&pk1,&pk2,0x60);
                                                        if (iVar18 == 0) {
                                                          iVar18 = secp256k1_keypair_create
                                                                             (CTX,(secp256k1_keypair
                                                                                   *)&pk2,
                                                                              (uchar *)&pk1);
                                                          if (iVar18 == 0) {
                                                            iVar18 = secp256k1_memcmp_var
                                                                               (&pk1,&pk2,0x60);
                                                            if (iVar18 == 0) {
                                                              iVar18 = secp256k1_keypair_create
                                                                                 (CTX,(
                                                  secp256k1_keypair *)&pk2,sk);
                                                  if (iVar18 == 0) {
                                                    iVar18 = secp256k1_memcmp_var(&pk1,&pk2,0x60);
                                                    if (iVar18 == 0) {
                                                      testrand256(tweak);
                                                      iVar18 = secp256k1_keypair_create
                                                                         (CTX,(secp256k1_keypair *)
                                                                              &pk2,tweak);
                                                      if (iVar18 == 0) {
                                                        pcVar20 = 
                                                  "test condition failed: secp256k1_keypair_create(CTX, &keypair, sk) == 1"
                                                  ;
                                                  uStack_e50 = 0x13b;
                                                  }
                                                  else {
                                                    pk.data[0x30] = (undefined1)pk2.infinity;
                                                    pk.data[0x31] = pk2.infinity._1_1_;
                                                    pk.data[0x32] = pk2.infinity._2_1_;
                                                    pk.data[0x33] = pk2.infinity._3_1_;
                                                    pk.data[0x34] = pk2._84_1_;
                                                    pk.data[0x35] = pk2._85_1_;
                                                    pk.data[0x36] = pk2._86_1_;
                                                    pk.data[0x37] = pk2._87_1_;
                                                    pk.data[0x38] = auStack_bc0[0];
                                                    pk.data[0x39] = auStack_bc0[1];
                                                    pk.data[0x3a] = auStack_bc0[2];
                                                    pk.data[0x3b] = auStack_bc0[3];
                                                    pk.data[0x3c] = auStack_bc0[4];
                                                    pk.data[0x3d] = auStack_bc0[5];
                                                    pk.data[0x3e] = auStack_bc0[6];
                                                    pk.data[0x3f] = auStack_bc0[7];
                                                    pk.data._32_16_ = pk2.y.n._24_16_;
                                                    pk.data._16_16_ = pk2.y.n._8_16_;
                                                    auVar12._12_4_ = 0;
                                                    auVar12[0] = xonly_pk_tmp.data[4];
                                                    auVar12[1] = xonly_pk_tmp.data[5];
                                                    auVar12[2] = xonly_pk_tmp.data[6];
                                                    auVar12[3] = xonly_pk_tmp.data[7];
                                                    auVar12[4] = xonly_pk_tmp.data[8];
                                                    auVar12[5] = xonly_pk_tmp.data[9];
                                                    auVar12[6] = xonly_pk_tmp.data[10];
                                                    auVar12[7] = xonly_pk_tmp.data[0xb];
                                                    auVar12[8] = xonly_pk_tmp.data[0xc];
                                                    auVar12[9] = xonly_pk_tmp.data[0xd];
                                                    auVar12[10] = xonly_pk_tmp.data[0xe];
                                                    auVar12[0xb] = xonly_pk_tmp.data[0xf];
                                                    xonly_pk_tmp.data._0_16_ = auVar12 << 0x20;
                                                    pk.data._0_16_ = pk2._32_16_;
                                                    xonly_pk.data._0_8_ = (CTX->illegal_callback).fn
                                                    ;
                                                    xonly_pk.data._8_8_ =
                                                         (CTX->illegal_callback).data;
                                                    secp256k1_context_set_illegal_callback
                                                              (CTX,counting_callback_fn,
                                                               &xonly_pk_tmp);
                                                    (*(CTX->illegal_callback).fn)
                                                              ("pubkey != NULL",
                                                               (CTX->illegal_callback).data);
                                                    psVar17 = CTX;
                                                    (CTX->illegal_callback).fn =
                                                         (_func_void_char_ptr_void_ptr *)
                                                         xonly_pk.data._0_8_;
                                                    (psVar17->illegal_callback).data =
                                                         (void *)xonly_pk.data._8_8_;
                                                    if (xonly_pk_tmp.data._0_4_ == 1) {
                                                      auVar13._12_4_ = 0;
                                                      auVar13[0] = xonly_pk_tmp.data[4];
                                                      auVar13[1] = xonly_pk_tmp.data[5];
                                                      auVar13[2] = xonly_pk_tmp.data[6];
                                                      auVar13[3] = xonly_pk_tmp.data[7];
                                                      auVar13[4] = xonly_pk_tmp.data[8];
                                                      auVar13[5] = xonly_pk_tmp.data[9];
                                                      auVar13[6] = xonly_pk_tmp.data[10];
                                                      auVar13[7] = xonly_pk_tmp.data[0xb];
                                                      auVar13[8] = xonly_pk_tmp.data[0xc];
                                                      auVar13[9] = xonly_pk_tmp.data[0xd];
                                                      auVar13[10] = xonly_pk_tmp.data[0xe];
                                                      auVar13[0xb] = xonly_pk_tmp.data[0xf];
                                                      xonly_pk_tmp.data._0_16_ = auVar13 << 0x20;
                                                      xonly_pk.data._0_8_ =
                                                           (psVar17->illegal_callback).fn;
                                                      xonly_pk.data._8_8_ =
                                                           (psVar17->illegal_callback).data;
                                                      secp256k1_context_set_illegal_callback
                                                                (psVar17,counting_callback_fn,
                                                                 &xonly_pk_tmp);
                                                      pk.data._0_16_ = ZEXT816(0);
                                                      pk.data._16_16_ = ZEXT816(0);
                                                      pk.data._32_16_ = ZEXT816(0);
                                                      pk.data._48_16_ = ZEXT816(0);
                                                      (*(CTX->illegal_callback).fn)
                                                                ("keypair != NULL",
                                                                 (CTX->illegal_callback).data);
                                                      psVar17 = CTX;
                                                      (CTX->illegal_callback).fn =
                                                           (_func_void_char_ptr_void_ptr *)
                                                           xonly_pk.data._0_8_;
                                                      (psVar17->illegal_callback).data =
                                                           (void *)xonly_pk.data._8_8_;
                                                      if (xonly_pk_tmp.data._0_4_ == 1) {
                                                        iVar18 = secp256k1_memcmp_var(&pk1,&pk,0x40)
                                                        ;
                                                        if (iVar18 == 0) {
                                                          stack0xfffffffffffff438 = ZEXT816(0);
                                                          pk2.y.n._24_16_ = ZEXT816(0);
                                                          pk2.y.n._8_16_ = ZEXT816(0);
                                                          pk2._32_16_ = ZEXT816(0);
                                                          pk2.x.n._16_16_ = ZEXT816(0);
                                                          pk2.x.n._0_16_ = ZEXT816(0);
                                                          pk.data._0_16_ = ZEXT816(0);
                                                          pk.data._16_16_ = ZEXT816(0);
                                                          pk.data._32_16_ = ZEXT816(0);
                                                          pk.data._48_16_ = ZEXT816(0);
                                                          iVar18 = secp256k1_memcmp_var
                                                                             (&pk1,&pk,0x40);
                                                          if (iVar18 == 0) {
                                                            iVar18 = secp256k1_ec_pubkey_create
                                                                               (psVar17,&pk,tweak);
                                                            if (iVar18 == 0) {
                                                              pcVar20 = 
                                                  "test condition failed: secp256k1_ec_pubkey_create(CTX, &pk, sk) == 1"
                                                  ;
                                                  uStack_e50 = 0x147;
                                                  }
                                                  else {
                                                    iVar18 = secp256k1_keypair_create
                                                                       (CTX,(secp256k1_keypair *)
                                                                            &pk2,tweak);
                                                    auVar3 = stack0xfffffffffffff438;
                                                    auVar2 = (undefined1  [16])pk2.y.n._24_16_;
                                                    auVar1 = (undefined1  [16])pk2.y.n._8_16_;
                                                    auVar24 = (undefined1  [16])pk2._32_16_;
                                                    if (iVar18 == 0) {
                                                      pcVar20 = 
                                                  "test condition failed: secp256k1_keypair_create(CTX, &keypair, sk) == 1"
                                                  ;
                                                  uStack_e50 = 0x148;
                                                  }
                                                  else {
                                                    xonly_pk.data._48_8_ = pk2._80_8_;
                                                    xonly_pk.data[0x38] = auStack_bc0[0];
                                                    xonly_pk.data[0x39] = auStack_bc0[1];
                                                    xonly_pk.data[0x3a] = auStack_bc0[2];
                                                    xonly_pk.data[0x3b] = auStack_bc0[3];
                                                    xonly_pk.data[0x3c] = auStack_bc0[4];
                                                    xonly_pk.data[0x3d] = auStack_bc0[5];
                                                    xonly_pk.data[0x3e] = auStack_bc0[6];
                                                    xonly_pk.data[0x3f] = auStack_bc0[7];
                                                    xonly_pk.data[0x20] = (undefined1)pk2.y.n[3];
                                                    xonly_pk.data[0x21] = pk2.y.n[3]._1_1_;
                                                    xonly_pk.data[0x22] = pk2.y.n[3]._2_1_;
                                                    xonly_pk.data[0x23] = pk2.y.n[3]._3_1_;
                                                    xonly_pk.data[0x24] = pk2.y.n[3]._4_1_;
                                                    xonly_pk.data[0x25] = pk2.y.n[3]._5_1_;
                                                    xonly_pk.data[0x26] = pk2.y.n[3]._6_1_;
                                                    xonly_pk.data[0x27] = pk2.y.n[3]._7_1_;
                                                    xonly_pk.data[0x28] = (undefined1)pk2.y.n[4];
                                                    xonly_pk.data[0x29] = pk2.y.n[4]._1_1_;
                                                    xonly_pk.data[0x2a] = pk2.y.n[4]._2_1_;
                                                    xonly_pk.data[0x2b] = pk2.y.n[4]._3_1_;
                                                    xonly_pk.data[0x2c] = pk2.y.n[4]._4_1_;
                                                    xonly_pk.data[0x2d] = pk2.y.n[4]._5_1_;
                                                    xonly_pk.data[0x2e] = pk2.y.n[4]._6_1_;
                                                    xonly_pk.data[0x2f] = pk2.y.n[4]._7_1_;
                                                    xonly_pk.data[0x10] = (undefined1)pk2.y.n[1];
                                                    xonly_pk.data[0x11] = pk2.y.n[1]._1_1_;
                                                    xonly_pk.data[0x12] = pk2.y.n[1]._2_1_;
                                                    xonly_pk.data[0x13] = pk2.y.n[1]._3_1_;
                                                    xonly_pk.data[0x14] = pk2.y.n[1]._4_1_;
                                                    xonly_pk.data[0x15] = pk2.y.n[1]._5_1_;
                                                    xonly_pk.data[0x16] = pk2.y.n[1]._6_1_;
                                                    xonly_pk.data[0x17] = pk2.y.n[1]._7_1_;
                                                    xonly_pk.data[0x18] = (undefined1)pk2.y.n[2];
                                                    xonly_pk.data[0x19] = pk2.y.n[2]._1_1_;
                                                    xonly_pk.data[0x1a] = pk2.y.n[2]._2_1_;
                                                    xonly_pk.data[0x1b] = pk2.y.n[2]._3_1_;
                                                    xonly_pk.data[0x1c] = pk2.y.n[2]._4_1_;
                                                    xonly_pk.data[0x1d] = pk2.y.n[2]._5_1_;
                                                    xonly_pk.data[0x1e] = pk2.y.n[2]._6_1_;
                                                    xonly_pk.data[0x1f] = pk2.y.n[2]._7_1_;
                                                    xonly_pk.data[0] = (undefined1)pk2.x.n[4];
                                                    xonly_pk.data[1] = pk2.x.n[4]._1_1_;
                                                    xonly_pk.data[2] = pk2.x.n[4]._2_1_;
                                                    xonly_pk.data[3] = pk2.x.n[4]._3_1_;
                                                    xonly_pk.data[4] = pk2.x.n[4]._4_1_;
                                                    xonly_pk.data[5] = pk2.x.n[4]._5_1_;
                                                    xonly_pk.data[6] = pk2.x.n[4]._6_1_;
                                                    xonly_pk.data[7] = pk2.x.n[4]._7_1_;
                                                    xonly_pk.data[8] = (undefined1)pk2.y.n[0];
                                                    xonly_pk.data[9] = pk2.y.n[0]._1_1_;
                                                    xonly_pk.data[10] = pk2.y.n[0]._2_1_;
                                                    xonly_pk.data[0xb] = pk2.y.n[0]._3_1_;
                                                    xonly_pk.data[0xc] = pk2.y.n[0]._4_1_;
                                                    xonly_pk.data[0xd] = pk2.y.n[0]._5_1_;
                                                    xonly_pk.data[0xe] = pk2.y.n[0]._6_1_;
                                                    xonly_pk.data[0xf] = pk2.y.n[0]._7_1_;
                                                    pk2._32_16_ = auVar24;
                                                    pk2.y.n._8_16_ = auVar1;
                                                    pk2.y.n._24_16_ = auVar2;
                                                    unique0x10004808 = auVar3;
                                                    iVar18 = secp256k1_memcmp_var
                                                                       (&pk,&xonly_pk,0x40);
                                                    if (iVar18 == 0) {
                                                      testrand256(tweak);
                                                      iVar18 = secp256k1_keypair_create
                                                                         (CTX,(secp256k1_keypair *)
                                                                              &pk2,tweak);
                                                      if (iVar18 == 0) {
                                                        pcVar20 = 
                                                  "test condition failed: secp256k1_keypair_create(CTX, &keypair, sk) == 1"
                                                  ;
                                                  uStack_e50 = 0x14e;
                                                  }
                                                  else {
                                                    iVar18 = secp256k1_keypair_xonly_pub
                                                                       (CTX,&xonly_pk_tmp,
                                                                        (int *)buf32,
                                                                        (secp256k1_keypair *)&pk2);
                                                    if (iVar18 == 0) {
                                                      pcVar20 = 
                                                  "test condition failed: secp256k1_keypair_xonly_pub(CTX, &xonly_pk, &pk_parity, &keypair) == 1"
                                                  ;
                                                  uStack_e50 = 0x14f;
                                                  }
                                                  else {
                                                    auVar14._12_4_ = 0;
                                                    auVar14._0_12_ = _auStack_e34;
                                                    __calls_to_callback_3 =
                                                         (secp256k1_callback)(auVar14 << 0x20);
                                                    zeros64._0_16_ =
                                                         *(undefined1 (*) [16])
                                                          &CTX->illegal_callback;
                                                    secp256k1_context_set_illegal_callback
                                                              (CTX,counting_callback_fn,
                                                               &_calls_to_callback_3);
                                                    (*(CTX->illegal_callback).fn)
                                                              ("pubkey != NULL",
                                                               (CTX->illegal_callback).data);
                                                    psVar17 = CTX;
                                                    (CTX->illegal_callback).fn =
                                                         (_func_void_char_ptr_void_ptr *)
                                                         zeros64._0_8_;
                                                    (psVar17->illegal_callback).data =
                                                         (void *)zeros64._8_8_;
                                                    if (_calls_to_callback_3 == 1) {
                                                      iVar18 = secp256k1_keypair_xonly_pub
                                                                         (psVar17,&xonly_pk_tmp,
                                                                          (int *)0x0,
                                                                          (secp256k1_keypair *)&pk2)
                                                      ;
                                                      if (iVar18 == 0) {
                                                        pcVar20 = 
                                                  "test condition failed: secp256k1_keypair_xonly_pub(CTX, &xonly_pk, NULL, &keypair) == 1"
                                                  ;
                                                  uStack_e50 = 0x151;
                                                  }
                                                  else {
                                                    auVar15._12_4_ = 0;
                                                    auVar15._0_12_ = _auStack_e34;
                                                    __calls_to_callback_3 =
                                                         (secp256k1_callback)(auVar15 << 0x20);
                                                    zeros64._0_16_ =
                                                         *(undefined1 (*) [16])
                                                          &CTX->illegal_callback;
                                                    secp256k1_context_set_illegal_callback
                                                              (CTX,counting_callback_fn,
                                                               &_calls_to_callback_3);
                                                    xonly_pk_tmp.data._0_16_ = ZEXT816(0);
                                                    xonly_pk_tmp.data._16_16_ = ZEXT816(0);
                                                    xonly_pk_tmp.data._32_16_ = ZEXT816(0);
                                                    xonly_pk_tmp.data._48_16_ = ZEXT816(0);
                                                    (*(CTX->illegal_callback).fn)
                                                              ("keypair != NULL",
                                                               (CTX->illegal_callback).data);
                                                    psVar17 = CTX;
                                                    (CTX->illegal_callback).fn =
                                                         (_func_void_char_ptr_void_ptr *)
                                                         zeros64._0_8_;
                                                    (psVar17->illegal_callback).data =
                                                         (void *)zeros64._8_8_;
                                                    if (_calls_to_callback_3 == 1) {
                                                      iVar18 = secp256k1_memcmp_var
                                                                         (&pk1,&xonly_pk_tmp,0x40);
                                                      if (iVar18 == 0) {
                                                        iVar18 = secp256k1_keypair_xonly_pub
                                                                           (psVar17,&xonly_pk_tmp,
                                                                            (int *)buf32,
                                                                            (secp256k1_keypair *)
                                                                            &pk2);
                                                        if (iVar18 == 0) {
                                                          pcVar20 = 
                                                  "test condition failed: secp256k1_keypair_xonly_pub(CTX, &xonly_pk, &pk_parity, &keypair) == 1"
                                                  ;
                                                  uStack_e50 = 0x156;
                                                  }
                                                  else {
                                                    stack0xfffffffffffff438 = ZEXT816(0);
                                                    pk2.y.n._24_16_ = ZEXT816(0);
                                                    pk2.y.n._8_16_ = ZEXT816(0);
                                                    pk2._32_16_ = ZEXT816(0);
                                                    pk2.x.n._16_16_ = ZEXT816(0);
                                                    auVar16._12_4_ = 0;
                                                    auVar16._0_12_ = _auStack_e34;
                                                    __calls_to_callback_3 =
                                                         (secp256k1_callback)(auVar16 << 0x20);
                                                    pk2.x.n._0_16_ = ZEXT816(0);
                                                    zeros64._0_16_ =
                                                         *(undefined1 (*) [16])
                                                          &CTX->illegal_callback;
                                                    secp256k1_context_set_illegal_callback
                                                              (CTX,counting_callback_fn,
                                                               &_calls_to_callback_3);
                                                    iVar18 = secp256k1_keypair_xonly_pub
                                                                       (CTX,&xonly_pk_tmp,
                                                                        (int *)buf32,
                                                                        (secp256k1_keypair *)&pk2);
                                                    psVar17 = CTX;
                                                    if (iVar18 == 0) {
                                                      (CTX->illegal_callback).fn =
                                                           (_func_void_char_ptr_void_ptr *)
                                                           zeros64._0_8_;
                                                      (psVar17->illegal_callback).data =
                                                           (void *)zeros64._8_8_;
                                                      if (_calls_to_callback_3 == 1) {
                                                        iVar18 = secp256k1_memcmp_var
                                                                           (&pk1,&xonly_pk_tmp,0x40)
                                                        ;
                                                        if (iVar18 == 0) {
                                                          iVar18 = secp256k1_ec_pubkey_create
                                                                             (psVar17,&pk,tweak);
                                                          if (iVar18 == 0) {
                                                            pcVar20 = 
                                                  "test condition failed: secp256k1_ec_pubkey_create(CTX, &pk, sk) == 1"
                                                  ;
                                                  uStack_e50 = 0x15c;
                                                  }
                                                  else {
                                                    iVar18 = secp256k1_xonly_pubkey_from_pubkey
                                                                       (CTX,&xonly_pk_tmp,
                                                                        (int *)buf32,&pk);
                                                    if (iVar18 == 0) {
                                                      pcVar20 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_from_pubkey(CTX, &xonly_pk, &pk_parity, &pk) == 1"
                                                  ;
                                                  uStack_e50 = 0x15d;
                                                  }
                                                  else {
                                                    iVar18 = secp256k1_keypair_create
                                                                       (CTX,(secp256k1_keypair *)
                                                                            &pk2,tweak);
                                                    if (iVar18 == 0) {
                                                      pcVar20 = 
                                                  "test condition failed: secp256k1_keypair_create(CTX, &keypair, sk) == 1"
                                                  ;
                                                  uStack_e50 = 0x15e;
                                                  }
                                                  else {
                                                    iVar18 = secp256k1_keypair_xonly_pub
                                                                       (CTX,(secp256k1_xonly_pubkey
                                                                             *)zeros64,(int *)ones32
                                                                        ,(secp256k1_keypair *)&pk2);
                                                    if (iVar18 == 0) {
                                                      pcVar20 = 
                                                  "test condition failed: secp256k1_keypair_xonly_pub(CTX, &xonly_pk_tmp, &pk_parity_tmp, &keypair) == 1"
                                                  ;
                                                  uStack_e50 = 0x15f;
                                                  }
                                                  else {
                                                    iVar18 = secp256k1_memcmp_var
                                                                       (&xonly_pk_tmp,zeros64,0x40);
                                                    if (iVar18 == 0) {
                                                      if (buf32._0_4_ == ones32._0_4_) {
                                                        testrand256(tweak);
                                                        iVar18 = secp256k1_keypair_create
                                                                           (CTX,(secp256k1_keypair *
                                                                                )&pk2,tweak);
                                                        if (iVar18 == 0) {
                                                          pcVar20 = 
                                                  "test condition failed: secp256k1_keypair_create(CTX, &keypair, sk) == 1"
                                                  ;
                                                  uStack_e50 = 0x165;
                                                  }
                                                  else {
                                                    xy_sk._0_8_ = xy_sk._0_8_ & 0xffffffff00000000;
                                                    __calls_to_callback_3 = CTX->illegal_callback;
                                                    secp256k1_context_set_illegal_callback
                                                              (CTX,counting_callback_fn,xy_sk);
                                                    (*(CTX->illegal_callback).fn)
                                                              ("seckey != NULL",
                                                               (CTX->illegal_callback).data);
                                                    psVar17 = CTX;
                                                    (CTX->illegal_callback).fn =
                                                         __calls_to_callback_3;
                                                    (psVar17->illegal_callback).data =
                                                         stack0xfffffffffffff1d0;
                                                    if (xy_sk._0_4_ == 1) {
                                                      pk_parity = 0;
                                                      xy_sk._0_8_ = (psVar17->illegal_callback).fn;
                                                      xy_sk._8_8_ = (psVar17->illegal_callback).data
                                                      ;
                                                      secp256k1_context_set_illegal_callback
                                                                (psVar17,counting_callback_fn,
                                                                 &pk_parity);
                                                      __calls_to_callback_3 =
                                                           (secp256k1_callback)ZEXT816(0);
                                                      local_e28 = ZEXT816(0);
                                                      (*(CTX->illegal_callback).fn)
                                                                ("keypair != NULL",
                                                                 (CTX->illegal_callback).data);
                                                      psVar17 = CTX;
                                                      (CTX->illegal_callback).fn =
                                                           (_func_void_char_ptr_void_ptr *)
                                                           xy_sk._0_8_;
                                                      (psVar17->illegal_callback).data =
                                                           (void *)xy_sk._8_8_;
                                                      if (pk_parity == 1) {
                                                        iVar18 = secp256k1_memcmp_var
                                                                           (&pk1,&
                                                  _calls_to_callback_3,0x20);
                                                  if (iVar18 == 0) {
                                                    iVar18 = secp256k1_keypair_create
                                                                       (psVar17,(secp256k1_keypair *
                                                                                )&pk2,tweak);
                                                    if (iVar18 == 0) {
                                                      pcVar20 = 
                                                  "test condition failed: secp256k1_keypair_create(CTX, &keypair, sk) == 1"
                                                  ;
                                                  uStack_e50 = 0x16c;
                                                  }
                                                  else {
                                                    local_e28._0_8_ = pk2.x.n[2];
                                                    local_e28._8_8_ = pk2.x.n[3];
                                                    __calls_to_callback_3 =
                                                         (_func_void_char_ptr_void_ptr *)pk2.x.n[0];
                                                    stack0xfffffffffffff1d0 = (void *)pk2.x.n[1];
                                                    iVar18 = secp256k1_memcmp_var
                                                                       (tweak,&_calls_to_callback_3,
                                                                        0x20);
                                                    if (iVar18 == 0) {
                                                      stack0xfffffffffffff438 =
                                                           (undefined1  [16])0x0;
                                                      pk2.y.n[3] = 0;
                                                      pk2.y.n[4] = 0;
                                                      pk2.y.n[1] = 0;
                                                      pk2.y.n[2] = 0;
                                                      pk2.x.n[4] = 0;
                                                      pk2.y.n[0] = 0;
                                                      pk2.x.n[2] = 0;
                                                      pk2.x.n[3] = 0;
                                                      pk2.x.n[0] = 0;
                                                      pk2.x.n[1] = 0;
                                                      __calls_to_callback_3 =
                                                           (_func_void_char_ptr_void_ptr *)0x0;
                                                      stack0xfffffffffffff1d0 = (void *)0x0;
                                                      local_e28 = (undefined1  [16])0x0;
                                                      iVar18 = secp256k1_memcmp_var
                                                                         (&pk1,&_calls_to_callback_3
                                                                          ,0x20);
                                                      if (iVar18 == 0) {
                                                        stack0xfffffffffffff438 =
                                                             (undefined1  [16])0x0;
                                                        pk2.y.n[3] = 0;
                                                        pk2.y.n[4] = 0;
                                                        pk2.y.n[1] = 0;
                                                        pk2.y.n[2] = 0;
                                                        pk2.x.n[4] = 0;
                                                        pk2.y.n[0] = 0;
                                                        pk2.x.n[2] = 0;
                                                        pk2.x.n[3] = 0;
                                                        pk2.x.n[0] = 0;
                                                        pk2.x.n[1] = 0;
                                                        testrand256(tweak);
                                                        testrand256(sk);
                                                        local_e28._8_4_ = 0xffffffff;
                                                        local_e28._0_8_ = 0xffffffffffffffff;
                                                        local_e28._12_4_ = 0xffffffff;
                                                        auStack_e34._4_4_ = 0xffffffff;
                                                        __calls_to_callback_3 =
                                                             (_func_void_char_ptr_void_ptr *)
                                                             0xffffffffffffffff;
                                                        uStack_e2c = 0xffffffff;
                                                        iVar18 = secp256k1_keypair_create
                                                                           (CTX,(secp256k1_keypair *
                                                                                )&pk1,tweak);
                                                        if (iVar18 == 0) {
                                                          pcVar20 = 
                                                  "test condition failed: secp256k1_keypair_create(CTX, &keypair, sk) == 1"
                                                  ;
                                                  uStack_e50 = 0x183;
                                                  }
                                                  else {
                                                    iVar18 = secp256k1_keypair_xonly_tweak_add
                                                                       (CTX,(secp256k1_keypair *)
                                                                            &pk1,sk);
                                                    if (iVar18 == 1) {
                                                      iVar18 = secp256k1_keypair_xonly_tweak_add
                                                                         (CTX,(secp256k1_keypair *)
                                                                              &pk1,sk);
                                                      if (iVar18 == 1) {
                                                        iVar18 = secp256k1_keypair_xonly_tweak_add
                                                                           (CTX,(secp256k1_keypair *
                                                                                )&pk1,sk);
                                                        if (iVar18 == 1) {
                                                          xonly_pk.data._0_8_ =
                                                               xonly_pk.data._0_8_ &
                                                               0xffffffff00000000;
                                                          pk.data._0_16_ = CTX->illegal_callback;
                                                          secp256k1_context_set_illegal_callback
                                                                    (CTX,counting_callback_fn,
                                                                     &xonly_pk);
                                                          (*(CTX->illegal_callback).fn)
                                                                    ("keypair != NULL",
                                                                     (CTX->illegal_callback).data);
                                                          psVar17 = CTX;
                                                          (CTX->illegal_callback).fn =
                                                               (_func_void_char_ptr_void_ptr *)
                                                               pk.data._0_8_;
                                                          (psVar17->illegal_callback).data =
                                                               (void *)pk.data._8_8_;
                                                          if (xonly_pk.data._0_4_ == 1) {
                                                            xonly_pk.data._0_8_ =
                                                                 xonly_pk.data._0_8_ &
                                                                 0xffffffff00000000;
                                                            pk.data._0_16_ =
                                                                 psVar17->illegal_callback;
                                                            secp256k1_context_set_illegal_callback
                                                                      (psVar17,counting_callback_fn,
                                                                       &xonly_pk);
                                                            (*(CTX->illegal_callback).fn)
                                                                      ("tweak32 != NULL",
                                                                       (CTX->illegal_callback).data)
                                                            ;
                                                            psVar17 = CTX;
                                                            (CTX->illegal_callback).fn =
                                                                 (_func_void_char_ptr_void_ptr *)
                                                                 pk.data._0_8_;
                                                            (psVar17->illegal_callback).data =
                                                                 (void *)pk.data._8_8_;
                                                            if (xonly_pk.data._0_4_ == 1) {
                                                              iVar18 = secp256k1_memcmp_var
                                                                                 (&pk1,&pk2,0x60);
                                                              if (iVar18 == 0) {
                                                                pcVar20 = 
                                                  "test condition failed: secp256k1_memcmp_var(&keypair, zeros96, sizeof(keypair)) != 0"
                                                  ;
                                                  uStack_e50 = 0x18b;
                                                  }
                                                  else {
                                                    iVar18 = secp256k1_keypair_create
                                                                       (psVar17,(secp256k1_keypair *
                                                                                )&pk1,tweak);
                                                    if (iVar18 == 0) {
                                                      pcVar20 = 
                                                  "test condition failed: secp256k1_keypair_create(CTX, &keypair, sk) == 1"
                                                  ;
                                                  uStack_e50 = 0x18e;
                                                  }
                                                  else {
                                                    iVar18 = secp256k1_keypair_xonly_tweak_add
                                                                       (CTX,(secp256k1_keypair *)
                                                                            &pk1,(uchar *)&
                                                  _calls_to_callback_3);
                                                  if (iVar18 == 0) {
                                                    iVar18 = secp256k1_memcmp_var(&pk1,&pk2,0x60);
                                                    if (iVar18 == 0) {
                                                      iVar18 = secp256k1_keypair_create
                                                                         (CTX,(secp256k1_keypair *)
                                                                              &pk1,tweak);
                                                      if (iVar18 == 0) {
                                                        pcVar20 = 
                                                  "test condition failed: secp256k1_keypair_create(CTX, &keypair, sk) == 1"
                                                  ;
                                                  uStack_e50 = 0x193;
                                                  }
                                                  else {
                                                    iVar18 = secp256k1_keypair_xonly_tweak_add
                                                                       (CTX,(secp256k1_keypair *)
                                                                            &pk1,(uchar *)&pk2);
                                                    if (iVar18 == 1) {
                                                      for (iVar18 = 0; iVar18 < COUNT;
                                                          iVar18 = iVar18 + 1) {
                                                        testrand256(tweak);
                                                        iVar19 = secp256k1_keypair_create
                                                                           (CTX,(secp256k1_keypair *
                                                                                )&pk1,tweak);
                                                        if (iVar19 == 0) {
                                                          pcVar20 = 
                                                  "test condition failed: secp256k1_keypair_create(CTX, &keypair, sk) == 1"
                                                  ;
                                                  uStack_e50 = 0x19b;
                                                  goto LAB_001243c8;
                                                  }
                                                  memcpy((secp256k1_keypair *)&pk,&pk1,0x60);
                                                  secp256k1_scalar_set_b32
                                                            ((secp256k1_scalar *)&xonly_pk,tweak,
                                                             (int *)0x0);
                                                  secp256k1_scalar_negate
                                                            ((secp256k1_scalar *)&xonly_pk,
                                                             (secp256k1_scalar *)&xonly_pk);
                                                  secp256k1_scalar_get_b32
                                                            (sk,(secp256k1_scalar *)&xonly_pk);
                                                  iVar19 = secp256k1_keypair_xonly_tweak_add
                                                                     (CTX,(secp256k1_keypair *)&pk1,
                                                                      tweak);
                                                  if ((iVar19 != 0) &&
                                                     (iVar19 = secp256k1_keypair_xonly_tweak_add
                                                                         (CTX,(secp256k1_keypair *)
                                                                              &pk,sk), iVar19 != 0))
                                                  {
                                                    pcVar20 = 
                                                  "test condition failed: (secp256k1_keypair_xonly_tweak_add(CTX, &keypair, sk) == 0) || (secp256k1_keypair_xonly_tweak_add(CTX, &keypair_tmp, tweak) == 0)"
                                                  ;
                                                  uStack_e50 = 0x1a3;
                                                  goto LAB_001243c8;
                                                  }
                                                  iVar19 = secp256k1_memcmp_var(&pk1,&pk2,0x60);
                                                  if ((iVar19 != 0) &&
                                                     (iVar19 = secp256k1_memcmp_var
                                                                         ((secp256k1_keypair *)&pk,
                                                                          &pk2,0x60), iVar19 != 0))
                                                  {
                                                    pcVar20 = 
                                                  "test condition failed: secp256k1_memcmp_var(&keypair, zeros96, sizeof(keypair)) == 0 || secp256k1_memcmp_var(&keypair_tmp, zeros96, sizeof(keypair_tmp)) == 0"
                                                  ;
                                                  uStack_e50 = 0x1a5;
                                                  goto LAB_001243c8;
                                                  }
                                                  }
                                                  stack0xfffffffffffff818 = (undefined1  [16])0x0;
                                                  pk1.y.n[3] = 0;
                                                  pk1.y.n[4] = 0;
                                                  pk1.y.n[1] = 0;
                                                  pk1.y.n[2] = 0;
                                                  pk1.x.n[4] = 0;
                                                  pk1.y.n[0] = 0;
                                                  pk1.x.n[2] = 0;
                                                  pk1.x.n[3] = 0;
                                                  pk1.x.n[0] = 0;
                                                  pk1.x.n[1] = 0;
                                                  testrand256(sk);
                                                  xonly_pk.data._0_8_ =
                                                       xonly_pk.data._0_8_ & 0xffffffff00000000;
                                                  pk.data._0_16_ = CTX->illegal_callback;
                                                  secp256k1_context_set_illegal_callback
                                                            (CTX,counting_callback_fn,&xonly_pk);
                                                  iVar18 = secp256k1_keypair_xonly_tweak_add
                                                                     (CTX,(secp256k1_keypair *)&pk1,
                                                                      sk);
                                                  psVar17 = CTX;
                                                  if (iVar18 == 0) {
                                                    (CTX->illegal_callback).fn =
                                                         (_func_void_char_ptr_void_ptr *)
                                                         pk.data._0_8_;
                                                    (psVar17->illegal_callback).data =
                                                         (void *)pk.data._8_8_;
                                                    if (xonly_pk.data._0_4_ == 1) {
                                                      iVar18 = secp256k1_memcmp_var(&pk1,&pk2,0x60);
                                                      if (iVar18 == 0) {
                                                        iVar18 = secp256k1_keypair_create
                                                                           (psVar17,(
                                                  secp256k1_keypair *)&pk1,tweak);
                                                  if (iVar18 == 0) {
                                                    pcVar20 = 
                                                  "test condition failed: secp256k1_keypair_create(CTX, &keypair, sk) == 1"
                                                  ;
                                                  uStack_e50 = 0x1ae;
                                                  }
                                                  else {
                                                    pk1.x.n._16_16_ = ZEXT816(0);
                                                    xonly_pk.data._0_8_ =
                                                         xonly_pk.data._0_8_ & 0xffffffff00000000;
                                                    pk1.x.n._0_16_ = ZEXT816(0);
                                                    pk.data._0_16_ = CTX->illegal_callback;
                                                    secp256k1_context_set_illegal_callback
                                                              (CTX,counting_callback_fn,&xonly_pk);
                                                    iVar18 = secp256k1_keypair_xonly_tweak_add
                                                                       (CTX,(secp256k1_keypair *)
                                                                            &pk1,sk);
                                                    psVar17 = CTX;
                                                    if (iVar18 == 0) {
                                                      (CTX->illegal_callback).fn =
                                                           (_func_void_char_ptr_void_ptr *)
                                                           pk.data._0_8_;
                                                      (psVar17->illegal_callback).data =
                                                           (void *)pk.data._8_8_;
                                                      if (xonly_pk.data._0_4_ == 1) {
                                                        iVar18 = secp256k1_keypair_create
                                                                           (psVar17,(
                                                  secp256k1_keypair *)&pk1,tweak);
                                                  if (iVar18 == 0) {
                                                    pcVar20 = 
                                                  "test condition failed: secp256k1_keypair_create(CTX, &keypair, sk) == 1"
                                                  ;
                                                  uStack_e50 = 0x1b2;
                                                  }
                                                  else {
                                                    stack0xfffffffffffff818 = ZEXT816(0);
                                                    pk1.y.n._24_16_ = ZEXT816(0);
                                                    pk1.y.n._8_16_ = ZEXT816(0);
                                                    xonly_pk.data._0_8_ =
                                                         xonly_pk.data._0_8_ & 0xffffffff00000000;
                                                    pk1._32_16_ = ZEXT816(0);
                                                    pk.data._0_16_ = CTX->illegal_callback;
                                                    secp256k1_context_set_illegal_callback
                                                              (CTX,counting_callback_fn,&xonly_pk);
                                                    iVar18 = secp256k1_keypair_xonly_tweak_add
                                                                       (CTX,(secp256k1_keypair *)
                                                                            &pk1,sk);
                                                    psVar17 = CTX;
                                                    if (iVar18 == 0) {
                                                      (CTX->illegal_callback).fn =
                                                           (_func_void_char_ptr_void_ptr *)
                                                           pk.data._0_8_;
                                                      (psVar17->illegal_callback).data =
                                                           (void *)pk.data._8_8_;
                                                      if (xonly_pk.data._0_4_ == 1) {
                                                        iVar18 = secp256k1_keypair_create
                                                                           (psVar17,(
                                                  secp256k1_keypair *)&pk1,tweak);
                                                  if (iVar18 == 0) {
                                                    pcVar20 = 
                                                  "test condition failed: secp256k1_keypair_create(CTX, &keypair, sk) == 1"
                                                  ;
                                                  uStack_e50 = 0x1b7;
                                                  }
                                                  else {
                                                    iVar18 = 0;
                                                    while( true ) {
                                                      if (COUNT <= iVar18) {
                                                        return;
                                                      }
                                                      testrand256(sk);
                                                      iVar19 = secp256k1_keypair_xonly_pub
                                                                         (CTX,(
                                                  secp256k1_xonly_pubkey *)&pk,(int *)0x0,
                                                  (secp256k1_keypair *)&pk1);
                                                  if (iVar19 == 0) break;
                                                  iVar19 = secp256k1_keypair_xonly_tweak_add
                                                                     (CTX,(secp256k1_keypair *)&pk1,
                                                                      sk);
                                                  if (iVar19 != 1) {
                                                    pcVar20 = 
                                                  "test condition failed: secp256k1_keypair_xonly_tweak_add(CTX, &keypair, tweak) == 1"
                                                  ;
                                                  uStack_e50 = 0x1c3;
                                                  goto LAB_001243c8;
                                                  }
                                                  iVar19 = secp256k1_keypair_xonly_pub
                                                                     (CTX,&xonly_pk,(int *)ones32,
                                                                      (secp256k1_keypair *)&pk1);
                                                  if (iVar19 == 0) {
                                                    pcVar20 = 
                                                  "test condition failed: secp256k1_keypair_xonly_pub(CTX, &output_pk, &pk_parity, &keypair) == 1"
                                                  ;
                                                  uStack_e50 = 0x1c4;
                                                  goto LAB_001243c8;
                                                  }
                                                  iVar19 = secp256k1_xonly_pubkey_serialize
                                                                     (CTX,xy_sk,&xonly_pk);
                                                  if (iVar19 == 0) {
                                                    pcVar20 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_serialize(CTX, pk32, &output_pk) == 1"
                                                  ;
                                                  uStack_e50 = 0x1c7;
                                                  goto LAB_001243c8;
                                                  }
                                                  iVar19 = secp256k1_xonly_pubkey_tweak_add_check
                                                                     (CTX,xy_sk,ones32._0_4_,
                                                                      (secp256k1_xonly_pubkey *)&pk,
                                                                      sk);
                                                  if (iVar19 == 0) {
                                                    pcVar20 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_tweak_add_check(CTX, pk32, pk_parity, &internal_pk, tweak) == 1"
                                                  ;
                                                  uStack_e50 = 0x1c8;
                                                  goto LAB_001243c8;
                                                  }
                                                  xonly_pk_tmp.data[0x30] = (undefined1)pk1.infinity
                                                  ;
                                                  xonly_pk_tmp.data[0x31] = pk1.infinity._1_1_;
                                                  xonly_pk_tmp.data[0x32] = pk1.infinity._2_1_;
                                                  xonly_pk_tmp.data[0x33] = pk1.infinity._3_1_;
                                                  xonly_pk_tmp.data[0x34] = pk1._84_1_;
                                                  xonly_pk_tmp.data[0x35] = pk1._85_1_;
                                                  xonly_pk_tmp.data[0x36] = pk1._86_1_;
                                                  xonly_pk_tmp.data[0x37] = pk1._87_1_;
                                                  xonly_pk_tmp.data[0x38] = uStack_7e0;
                                                  xonly_pk_tmp.data[0x39] = uStack_7df;
                                                  xonly_pk_tmp.data[0x3a] = uStack_7de;
                                                  xonly_pk_tmp.data[0x3b] = uStack_7dd;
                                                  xonly_pk_tmp.data[0x3c] = uStack_7dc;
                                                  xonly_pk_tmp.data[0x3d] = uStack_7db;
                                                  xonly_pk_tmp.data[0x3e] = uStack_7da;
                                                  xonly_pk_tmp.data[0x3f] = uStack_7d9;
                                                  xonly_pk_tmp.data._32_16_ = pk1.y.n._24_16_;
                                                  xonly_pk_tmp.data._16_16_ = pk1.y.n._8_16_;
                                                  xonly_pk_tmp.data._0_16_ = pk1._32_16_;
                                                  iVar19 = secp256k1_xonly_pubkey_tweak_add
                                                                     (CTX,(secp256k1_pubkey *)
                                                                          zeros64,
                                                                      (secp256k1_xonly_pubkey *)&pk,
                                                                      sk);
                                                  if (iVar19 == 0) {
                                                    pcVar20 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_tweak_add(CTX, &output_pk_expected, &internal_pk, tweak) == 1"
                                                  ;
                                                  uStack_e50 = 0x1cc;
                                                  goto LAB_001243c8;
                                                  }
                                                  iVar19 = secp256k1_memcmp_var
                                                                     (&xonly_pk_tmp,
                                                                      (secp256k1_pubkey *)zeros64,
                                                                      0x40);
                                                  auVar1 = (undefined1  [16])pk1.x.n._16_16_;
                                                  auVar24 = (undefined1  [16])pk1.x.n._0_16_;
                                                  if (iVar19 != 0) {
                                                    pcVar20 = 
                                                  "test condition failed: secp256k1_memcmp_var(&output_pk_xy, &output_pk_expected, sizeof(output_pk_xy)) == 0"
                                                  ;
                                                  uStack_e50 = 0x1cd;
                                                  goto LAB_001243c8;
                                                  }
                                                  buf32[0x10] = (undefined1)pk1.x.n[2];
                                                  buf32[0x11] = pk1.x.n[2]._1_1_;
                                                  buf32[0x12] = pk1.x.n[2]._2_1_;
                                                  buf32[0x13] = pk1.x.n[2]._3_1_;
                                                  buf32[0x14] = pk1.x.n[2]._4_1_;
                                                  buf32[0x15] = pk1.x.n[2]._5_1_;
                                                  buf32[0x16] = pk1.x.n[2]._6_1_;
                                                  buf32[0x17] = pk1.x.n[2]._7_1_;
                                                  buf32[0x18] = (undefined1)pk1.x.n[3];
                                                  buf32[0x19] = pk1.x.n[3]._1_1_;
                                                  buf32[0x1a] = pk1.x.n[3]._2_1_;
                                                  buf32[0x1b] = pk1.x.n[3]._3_1_;
                                                  buf32[0x1c] = pk1.x.n[3]._4_1_;
                                                  buf32[0x1d] = pk1.x.n[3]._5_1_;
                                                  buf32[0x1e] = pk1.x.n[3]._6_1_;
                                                  buf32[0x1f] = pk1.x.n[3]._7_1_;
                                                  buf32[0] = (undefined1)pk1.x.n[0];
                                                  buf32[1] = pk1.x.n[0]._1_1_;
                                                  buf32[2] = pk1.x.n[0]._2_1_;
                                                  buf32[3] = pk1.x.n[0]._3_1_;
                                                  buf32[4] = pk1.x.n[0]._4_1_;
                                                  buf32[5] = pk1.x.n[0]._5_1_;
                                                  buf32[6] = pk1.x.n[0]._6_1_;
                                                  buf32[7] = pk1.x.n[0]._7_1_;
                                                  buf32[8] = (undefined1)pk1.x.n[1];
                                                  buf32[9] = pk1.x.n[1]._1_1_;
                                                  buf32[10] = pk1.x.n[1]._2_1_;
                                                  buf32[0xb] = pk1.x.n[1]._3_1_;
                                                  buf32[0xc] = pk1.x.n[1]._4_1_;
                                                  buf32[0xd] = pk1.x.n[1]._5_1_;
                                                  buf32[0xe] = pk1.x.n[1]._6_1_;
                                                  buf32[0xf] = pk1.x.n[1]._7_1_;
                                                  pk1.x.n._0_16_ = auVar24;
                                                  pk1.x.n._16_16_ = auVar1;
                                                  iVar19 = secp256k1_ec_pubkey_create
                                                                     (CTX,(secp256k1_pubkey *)
                                                                          zeros64,buf32);
                                                  if (iVar19 == 0) {
                                                    pcVar20 = 
                                                  "test condition failed: secp256k1_ec_pubkey_create(CTX, &output_pk_expected, sk32) == 1"
                                                  ;
                                                  uStack_e50 = 0x1d1;
                                                  goto LAB_001243c8;
                                                  }
                                                  iVar19 = secp256k1_memcmp_var
                                                                     (&xonly_pk_tmp,
                                                                      (secp256k1_pubkey *)zeros64,
                                                                      0x40);
                                                  if (iVar19 != 0) {
                                                    pcVar20 = 
                                                  "test condition failed: secp256k1_memcmp_var(&output_pk_xy, &output_pk_expected, sizeof(output_pk_xy)) == 0"
                                                  ;
                                                  uStack_e50 = 0x1d2;
                                                  goto LAB_001243c8;
                                                  }
                                                  iVar18 = iVar18 + 1;
                                                  }
                                                  pcVar20 = 
                                                  "test condition failed: secp256k1_keypair_xonly_pub(CTX, &internal_pk, NULL, &keypair) == 1"
                                                  ;
                                                  uStack_e50 = 0x1c2;
                                                  }
                                                  goto LAB_001243c8;
                                                  }
                                                  pcVar20 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  }
                                                  else {
                                                    pcVar20 = 
                                                  "test condition failed: (secp256k1_keypair_xonly_tweak_add(CTX, &keypair, tweak)) == 0"
                                                  ;
                                                  }
                                                  uStack_e50 = 0x1b4;
                                                  }
                                                  goto LAB_001243c8;
                                                  }
                                                  pcVar20 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  }
                                                  else {
                                                    pcVar20 = 
                                                  "test condition failed: (secp256k1_keypair_xonly_tweak_add(CTX, &keypair, tweak)) == 0"
                                                  ;
                                                  }
                                                  uStack_e50 = 0x1b0;
                                                  }
                                                  }
                                                  else {
                                                    pcVar20 = 
                                                  "test condition failed: secp256k1_memcmp_var(&keypair, zeros96, sizeof(keypair)) == 0"
                                                  ;
                                                  uStack_e50 = 0x1ac;
                                                  }
                                                  goto LAB_001243c8;
                                                  }
                                                  pcVar20 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  }
                                                  else {
                                                    pcVar20 = 
                                                  "test condition failed: (secp256k1_keypair_xonly_tweak_add(CTX, &keypair, tweak)) == 0"
                                                  ;
                                                  }
                                                  uStack_e50 = 0x1ab;
                                                  }
                                                  else {
                                                    pcVar20 = 
                                                  "test condition failed: secp256k1_keypair_xonly_tweak_add(CTX, &keypair, zeros96) == 1"
                                                  ;
                                                  uStack_e50 = 0x194;
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    pcVar20 = 
                                                  "test condition failed: secp256k1_memcmp_var(&keypair, zeros96, sizeof(keypair)) == 0"
                                                  ;
                                                  uStack_e50 = 400;
                                                  }
                                                  }
                                                  else {
                                                    pcVar20 = 
                                                  "test condition failed: secp256k1_keypair_xonly_tweak_add(CTX, &keypair, overflows) == 0"
                                                  ;
                                                  uStack_e50 = 399;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    pcVar20 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  uStack_e50 = 0x189;
                                                  }
                                                  }
                                                  else {
                                                    pcVar20 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  uStack_e50 = 0x188;
                                                  }
                                                  }
                                                  else {
                                                    pcVar20 = 
                                                  "test condition failed: secp256k1_keypair_xonly_tweak_add(CTX, &keypair, tweak) == 1"
                                                  ;
                                                  uStack_e50 = 0x187;
                                                  }
                                                  }
                                                  else {
                                                    pcVar20 = 
                                                  "test condition failed: secp256k1_keypair_xonly_tweak_add(CTX, &keypair, tweak) == 1"
                                                  ;
                                                  uStack_e50 = 0x186;
                                                  }
                                                  }
                                                  else {
                                                    pcVar20 = 
                                                  "test condition failed: secp256k1_keypair_xonly_tweak_add(CTX, &keypair, tweak) == 1"
                                                  ;
                                                  uStack_e50 = 0x185;
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    pcVar20 = 
                                                  "test condition failed: secp256k1_memcmp_var(zeros96, sk_tmp, sizeof(sk_tmp)) == 0"
                                                  ;
                                                  uStack_e50 = 0x174;
                                                  }
                                                  }
                                                  else {
                                                    pcVar20 = 
                                                  "test condition failed: secp256k1_memcmp_var(sk, sk_tmp, sizeof(sk_tmp)) == 0"
                                                  ;
                                                  uStack_e50 = 0x16e;
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    pcVar20 = 
                                                  "test condition failed: secp256k1_memcmp_var(zeros96, sk_tmp, sizeof(sk_tmp)) == 0"
                                                  ;
                                                  uStack_e50 = 0x169;
                                                  }
                                                  }
                                                  else {
                                                    pcVar20 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  uStack_e50 = 0x168;
                                                  }
                                                  }
                                                  else {
                                                    pcVar20 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  uStack_e50 = 0x167;
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    pcVar20 = 
                                                  "test condition failed: pk_parity == pk_parity_tmp"
                                                  ;
                                                  uStack_e50 = 0x161;
                                                  }
                                                  }
                                                  else {
                                                    pcVar20 = 
                                                  "test condition failed: secp256k1_memcmp_var(&xonly_pk, &xonly_pk_tmp, sizeof(pk)) == 0"
                                                  ;
                                                  uStack_e50 = 0x160;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    pcVar20 = 
                                                  "test condition failed: secp256k1_memcmp_var(zeros96, &xonly_pk, sizeof(xonly_pk)) == 0"
                                                  ;
                                                  uStack_e50 = 0x159;
                                                  }
                                                  goto LAB_001243c8;
                                                  }
                                                  pcVar20 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  }
                                                  else {
                                                    pcVar20 = 
                                                  "test condition failed: (secp256k1_keypair_xonly_pub(CTX, &xonly_pk, &pk_parity, &keypair)) == 0"
                                                  ;
                                                  }
                                                  uStack_e50 = 0x158;
                                                  }
                                                  }
                                                  else {
                                                    pcVar20 = 
                                                  "test condition failed: secp256k1_memcmp_var(zeros96, &xonly_pk, sizeof(xonly_pk)) == 0"
                                                  ;
                                                  uStack_e50 = 0x153;
                                                  }
                                                  }
                                                  else {
                                                    pcVar20 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  uStack_e50 = 0x152;
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    pcVar20 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  uStack_e50 = 0x150;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    pcVar20 = 
                                                  "test condition failed: secp256k1_memcmp_var(&pk, &pk_tmp, sizeof(pk)) == 0"
                                                  ;
                                                  uStack_e50 = 0x14a;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    pcVar20 = 
                                                  "test condition failed: secp256k1_memcmp_var(zeros96, &pk, sizeof(pk)) == 0"
                                                  ;
                                                  uStack_e50 = 0x144;
                                                  }
                                                  }
                                                  else {
                                                    pcVar20 = 
                                                  "test condition failed: secp256k1_memcmp_var(zeros96, &pk, sizeof(pk)) == 0"
                                                  ;
                                                  uStack_e50 = 0x13f;
                                                  }
                                                  }
                                                  else {
                                                    pcVar20 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  uStack_e50 = 0x13e;
                                                  }
                                                  }
                                                  else {
                                                    pcVar20 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  uStack_e50 = 0x13d;
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    pcVar20 = 
                                                  "test condition failed: secp256k1_memcmp_var(zeros96, &keypair, sizeof(keypair)) == 0"
                                                  ;
                                                  uStack_e50 = 0x137;
                                                  }
                                                  }
                                                  else {
                                                    pcVar20 = 
                                                  "test condition failed: secp256k1_keypair_create(CTX, &keypair, overflows) == 0"
                                                  ;
                                                  uStack_e50 = 0x136;
                                                  }
                                                  }
                                                  else {
                                                    pcVar20 = 
                                                  "test condition failed: secp256k1_memcmp_var(zeros96, &keypair, sizeof(keypair)) == 0"
                                                  ;
                                                  uStack_e50 = 0x135;
                                                  }
                                                  }
                                                  else {
                                                    pcVar20 = 
                                                  "test condition failed: secp256k1_keypair_create(CTX, &keypair, zeros96) == 0"
                                                  ;
                                                  uStack_e50 = 0x134;
                                                  }
                                                  }
                                                  else {
                                                    pcVar20 = 
                                                  "test condition failed: secp256k1_memcmp_var(zeros96, &keypair, sizeof(keypair)) == 0"
                                                  ;
                                                  uStack_e50 = 0x131;
                                                  }
                                                  goto LAB_001243c8;
                                                  }
                                                  pcVar20 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  }
                                                  else {
                                                    pcVar20 = 
                                                  "test condition failed: (secp256k1_keypair_create(STATIC_CTX, &keypair, sk)) == 0"
                                                  ;
                                                  }
                                                  uStack_e50 = 0x130;
                                                  }
                                                  }
                                                  else {
                                                    pcVar20 = 
                                                  "test condition failed: secp256k1_memcmp_var(zeros96, &keypair, sizeof(keypair)) == 0"
                                                  ;
                                                  uStack_e50 = 0x12e;
                                                  }
                                                  goto LAB_001243c8;
                                                  }
                                                  pcVar20 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  }
                                                  else {
                                                    pcVar20 = 
                                                  "test condition failed: (secp256k1_keypair_create(CTX, &keypair, ((void*)0))) == 0"
                                                  ;
                                                  }
                                                  uStack_e50 = 0x12d;
                                                  }
                                                  else {
                                                    pcVar20 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  uStack_e50 = 300;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  goto LAB_001243c8;
                                                  }
                                                  pcVar20 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  }
                                                  uStack_e50 = 0x8c;
                                                  }
                                                  else {
                                                    pcVar20 = "test condition failed: ecount == 2";
                                                    uStack_e50 = 0x89;
                                                  }
                                                  }
                                                  else {
                                                    pcVar20 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_cmp(CTX, &pk1, &pk1) == 0"
                                                  ;
                                                  uStack_e50 = 0x88;
                                                  }
                                                  goto LAB_001243c8;
                                                  }
                                                  pcVar20 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  }
                                                  else {
                                                    pcVar20 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_cmp(CTX, &pk1, &pk2) < 0"
                                                  ;
                                                  }
                                                  uStack_e50 = 0x84;
                                                  }
                                                  else {
                                                    pcVar20 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_cmp(CTX, &pk2, &pk2) == 0"
                                                  ;
                                                  uStack_e50 = 0x82;
                                                  }
                                                  }
                                                  else {
                                                    pcVar20 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_cmp(CTX, &pk1, &pk1) == 0"
                                                  ;
                                                  uStack_e50 = 0x81;
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    pcVar20 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_cmp(CTX, &pk1, &pk2) < 0"
                                                  ;
                                                  uStack_e50 = 0x7f;
                                                  }
                                                  goto LAB_001243c8;
                                                  }
                                                  pcVar20 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  }
                                                  uStack_e50 = 0x7e;
                                                  goto LAB_001243c8;
                                                  }
                                                  pcVar20 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  }
                                                  else {
                                                    pcVar20 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_cmp(CTX, NULL, &pk2) < 0"
                                                  ;
                                                  }
                                                  uStack_e50 = 0x7d;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    pcVar20 = 
                                                  "test condition failed: secp256k1_memcmp_var(&output_pk, zeros64, sizeof(output_pk)) == 0"
                                                  ;
                                                  uStack_e50 = 0xf5;
                                                  }
                                                  }
                                                  else {
                                                    pcVar20 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_tweak_add(CTX, &output_pk, &internal_xonly_pk, overflows) == 0"
                                                  ;
                                                  uStack_e50 = 0xf4;
                                                  }
                                                  }
                                                  else {
                                                    pcVar20 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_tweak_add_check(CTX, output_pk32, pk_parity, &internal_xonly_pk, overflows) == 0"
                                                  ;
                                                  uStack_e50 = 0xf3;
                                                  }
                                                  }
                                                  else {
                                                    pcVar20 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_tweak_add_check(CTX, buf32, pk_parity, &internal_xonly_pk, tweak) == 0"
                                                  ;
                                                  uStack_e50 = 0xf0;
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    pcVar20 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_tweak_add_check(CTX, output_pk32, !pk_parity, &internal_xonly_pk, tweak) == 0"
                                                  ;
                                                  uStack_e50 = 0xed;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    pcVar20 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  uStack_e50 = 0xe3;
                                                  }
                                                  }
                                                  else {
                                                    pcVar20 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  uStack_e50 = 0xe2;
                                                  }
                                                  }
                                                  else {
                                                    pcVar20 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_tweak_add_check(CTX, buf32, 2, &internal_xonly_pk, tweak) == 0"
                                                  ;
                                                  uStack_e50 = 0xe1;
                                                  }
                                                  }
                                                  else {
                                                    pcVar20 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  uStack_e50 = 0xdf;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    pcVar20 = 
                                                  "test condition failed: secp256k1_memcmp_var(&output_pk, zeros64, sizeof(output_pk)) == 0"
                                                  ;
                                                  uStack_e50 = 0xc3;
                                                  }
                                                  goto LAB_001243c8;
                                                  }
                                                  pcVar20 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  }
                                                  else {
                                                    pcVar20 = 
                                                  "test condition failed: (secp256k1_xonly_pubkey_tweak_add(CTX, &output_pk, &internal_xonly_pk, tweak)) == 0"
                                                  ;
                                                  }
                                                  uStack_e50 = 0xc2;
                                                  }
                                                  }
                                                  else {
                                                    pcVar20 = 
                                                  "test condition failed: secp256k1_memcmp_var(&output_pk, zeros64, sizeof(output_pk)) == 0"
                                                  ;
                                                  uStack_e50 = 0xad;
                                                  }
                                                  }
                                                  else {
                                                    pcVar20 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_tweak_add(CTX, &output_pk, &internal_xonly_pk, overflows) == 0"
                                                  ;
                                                  uStack_e50 = 0xac;
                                                  }
                                                  }
                                                  else {
                                                    pcVar20 = 
                                                  "test condition failed: secp256k1_memcmp_var(&output_pk, zeros64, sizeof(output_pk)) == 0"
                                                  ;
                                                  uStack_e50 = 0xa9;
                                                  }
                                                  }
                                                  else {
                                                    pcVar20 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  uStack_e50 = 0xa7;
                                                  }
                                                  }
                                                  else {
                                                    pcVar20 = 
                                                  "test condition failed: secp256k1_memcmp_var(&output_pk, zeros64, sizeof(output_pk)) == 0"
                                                  ;
                                                  uStack_e50 = 0xa6;
                                                  }
                                                  }
                                                  else {
                                                    pcVar20 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  uStack_e50 = 0xa4;
                                                  }
                                                  }
                                                  else {
                                                    pcVar20 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  uStack_e50 = 0xa3;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    pcVar20 = 
                                                  "test condition failed: secp256k1_memcmp_var(&xonly_pk, zeros64, sizeof(xonly_pk)) == 0"
                                                  ;
                                                  uStack_e50 = 0x5c;
                                                  }
                                                  }
                                                  else {
                                                    pcVar20 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_parse(CTX, &xonly_pk, zeros64) == 0"
                                                  ;
                                                  uStack_e50 = 0x5b;
                                                  }
                                                  }
                                                  else {
                                                    pcVar20 = 
                                                  "test condition failed: secp256k1_memcmp_var(&xonly_pk, zeros64, sizeof(xonly_pk)) == 0"
                                                  ;
                                                  uStack_e50 = 0x58;
                                                  }
                                                  }
                                                  else {
                                                    pcVar20 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_parse(CTX, &xonly_pk, ones32) == 0"
                                                  ;
                                                  uStack_e50 = 0x57;
                                                  }
                                                  }
                                                  else {
                                                    pcVar20 = 
                                                  "test condition failed: secp256k1_memcmp_var(&xonly_pk, &xonly_pk_tmp, sizeof(xonly_pk)) == 0"
                                                  ;
                                                  uStack_e50 = 0x52;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    pcVar20 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  uStack_e50 = 0x4c;
                                                  }
                                                }
                                                else {
                                                  pcVar20 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  uStack_e50 = 0x4b;
                                                }
                                              }
                                              goto LAB_001243c8;
                                            }
                                            pcVar20 = 
                                            "test condition failed: _calls_to_callback == 1";
                                          }
                                          else {
                                            pcVar20 = 
                                            "test condition failed: (secp256k1_xonly_pubkey_serialize(CTX, buf32, &pk_tmp)) == 0"
                                            ;
                                          }
                                          uStack_e50 = 0x47;
                                        }
                                        else {
                                          pcVar20 = 
                                          "test condition failed: secp256k1_memcmp_var(buf32, zeros64, 32) == 0"
                                          ;
                                          uStack_e50 = 0x40;
                                        }
                                      }
                                      else {
                                        pcVar20 = "test condition failed: _calls_to_callback == 1";
                                        uStack_e50 = 0x3f;
                                      }
                                    }
                                    else {
                                      pcVar20 = "test condition failed: _calls_to_callback == 1";
                                      uStack_e50 = 0x3e;
                                    }
                                  }
                                }
                              }
                              else {
                                pcVar20 = "test condition failed: pk_parity == 1";
                                uStack_e50 = 0x36;
                              }
                            }
                          }
                        }
                        else {
                          pcVar20 = "test condition failed: pk_parity == 0";
                          uStack_e50 = 0x2e;
                        }
                      }
                      else {
                        pcVar20 = 
                        "test condition failed: secp256k1_memcmp_var(&pk, &xonly_pk, sizeof(pk)) == 0"
                        ;
                        uStack_e50 = 0x2d;
                      }
                    }
                  }
                  goto LAB_001243c8;
                }
                pcVar20 = "test condition failed: _calls_to_callback == 1";
              }
              else {
                pcVar20 = 
                "test condition failed: (secp256k1_xonly_pubkey_from_pubkey(CTX, &xonly_pk, &pk_parity, &pk)) == 0"
                ;
              }
              uStack_e50 = 0x26;
            }
            else {
              pcVar20 = "test condition failed: _calls_to_callback == 1";
              uStack_e50 = 0x24;
            }
          }
        }
        else {
          pcVar20 = "test condition failed: _calls_to_callback == 1";
          uStack_e50 = 0x22;
        }
      }
    }
  }
LAB_001243c8:
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/modules/extrakeys/tests_impl.h"
          ,uStack_e50,pcVar20);
  abort();
}

Assistant:

static void test_xonly_pubkey(void) {
    secp256k1_pubkey pk;
    secp256k1_xonly_pubkey xonly_pk, xonly_pk_tmp;
    secp256k1_ge pk1;
    secp256k1_ge pk2;
    secp256k1_fe y;
    unsigned char sk[32];
    unsigned char xy_sk[32];
    unsigned char buf32[32];
    unsigned char ones32[32];
    unsigned char zeros64[64] = { 0 };
    int pk_parity;
    int i;

    testrand256(sk);
    memset(ones32, 0xFF, 32);
    testrand256(xy_sk);
    CHECK(secp256k1_ec_pubkey_create(CTX, &pk, sk) == 1);
    CHECK(secp256k1_xonly_pubkey_from_pubkey(CTX, &xonly_pk, &pk_parity, &pk) == 1);

    /* Test xonly_pubkey_from_pubkey */
    CHECK(secp256k1_xonly_pubkey_from_pubkey(CTX, &xonly_pk, &pk_parity, &pk) == 1);
    CHECK_ILLEGAL(CTX, secp256k1_xonly_pubkey_from_pubkey(CTX, NULL, &pk_parity, &pk));
    CHECK(secp256k1_xonly_pubkey_from_pubkey(CTX, &xonly_pk, NULL, &pk) == 1);
    CHECK_ILLEGAL(CTX, secp256k1_xonly_pubkey_from_pubkey(CTX, &xonly_pk, &pk_parity, NULL));
    memset(&pk, 0, sizeof(pk));
    CHECK_ILLEGAL(CTX, secp256k1_xonly_pubkey_from_pubkey(CTX, &xonly_pk, &pk_parity, &pk));

    /* Choose a secret key such that the resulting pubkey and xonly_pubkey match. */
    memset(sk, 0, sizeof(sk));
    sk[0] = 1;
    CHECK(secp256k1_ec_pubkey_create(CTX, &pk, sk) == 1);
    CHECK(secp256k1_xonly_pubkey_from_pubkey(CTX, &xonly_pk, &pk_parity, &pk) == 1);
    CHECK(secp256k1_memcmp_var(&pk, &xonly_pk, sizeof(pk)) == 0);
    CHECK(pk_parity == 0);

    /* Choose a secret key such that pubkey and xonly_pubkey are each others
     * negation. */
    sk[0] = 2;
    CHECK(secp256k1_ec_pubkey_create(CTX, &pk, sk) == 1);
    CHECK(secp256k1_xonly_pubkey_from_pubkey(CTX, &xonly_pk, &pk_parity, &pk) == 1);
    CHECK(secp256k1_memcmp_var(&xonly_pk, &pk, sizeof(xonly_pk)) != 0);
    CHECK(pk_parity == 1);
    secp256k1_pubkey_load(CTX, &pk1, &pk);
    secp256k1_pubkey_load(CTX, &pk2, (secp256k1_pubkey *) &xonly_pk);
    CHECK(secp256k1_fe_equal(&pk1.x, &pk2.x) == 1);
    secp256k1_fe_negate(&y, &pk2.y, 1);
    CHECK(secp256k1_fe_equal(&pk1.y, &y) == 1);

    /* Test xonly_pubkey_serialize and xonly_pubkey_parse */
    CHECK_ILLEGAL(CTX, secp256k1_xonly_pubkey_serialize(CTX, NULL, &xonly_pk));
    CHECK_ILLEGAL(CTX, secp256k1_xonly_pubkey_serialize(CTX, buf32, NULL));
    CHECK(secp256k1_memcmp_var(buf32, zeros64, 32) == 0);
    {
        /* A pubkey filled with 0s will fail to serialize due to pubkey_load
         * special casing. */
        secp256k1_xonly_pubkey pk_tmp;
        memset(&pk_tmp, 0, sizeof(pk_tmp));
        /* pubkey_load calls illegal callback */
        CHECK_ILLEGAL(CTX, secp256k1_xonly_pubkey_serialize(CTX, buf32, &pk_tmp));
    }

    CHECK(secp256k1_xonly_pubkey_serialize(CTX, buf32, &xonly_pk) == 1);
    CHECK_ILLEGAL(CTX, secp256k1_xonly_pubkey_parse(CTX, NULL, buf32));
    CHECK_ILLEGAL(CTX, secp256k1_xonly_pubkey_parse(CTX, &xonly_pk, NULL));

    /* Serialization and parse roundtrip */
    CHECK(secp256k1_xonly_pubkey_from_pubkey(CTX, &xonly_pk, NULL, &pk) == 1);
    CHECK(secp256k1_xonly_pubkey_serialize(CTX, buf32, &xonly_pk) == 1);
    CHECK(secp256k1_xonly_pubkey_parse(CTX, &xonly_pk_tmp, buf32) == 1);
    CHECK(secp256k1_memcmp_var(&xonly_pk, &xonly_pk_tmp, sizeof(xonly_pk)) == 0);

    /* Test parsing invalid field elements */
    memset(&xonly_pk, 1, sizeof(xonly_pk));
    /* Overflowing field element */
    CHECK(secp256k1_xonly_pubkey_parse(CTX, &xonly_pk, ones32) == 0);
    CHECK(secp256k1_memcmp_var(&xonly_pk, zeros64, sizeof(xonly_pk)) == 0);
    memset(&xonly_pk, 1, sizeof(xonly_pk));
    /* There's no point with x-coordinate 0 on secp256k1 */
    CHECK(secp256k1_xonly_pubkey_parse(CTX, &xonly_pk, zeros64) == 0);
    CHECK(secp256k1_memcmp_var(&xonly_pk, zeros64, sizeof(xonly_pk)) == 0);
    /* If a random 32-byte string can not be parsed with ec_pubkey_parse
     * (because interpreted as X coordinate it does not correspond to a point on
     * the curve) then xonly_pubkey_parse should fail as well. */
    for (i = 0; i < COUNT; i++) {
        unsigned char rand33[33];
        testrand256(&rand33[1]);
        rand33[0] = SECP256K1_TAG_PUBKEY_EVEN;
        if (!secp256k1_ec_pubkey_parse(CTX, &pk, rand33, 33)) {
            memset(&xonly_pk, 1, sizeof(xonly_pk));
            CHECK(secp256k1_xonly_pubkey_parse(CTX, &xonly_pk, &rand33[1]) == 0);
            CHECK(secp256k1_memcmp_var(&xonly_pk, zeros64, sizeof(xonly_pk)) == 0);
        } else {
            CHECK(secp256k1_xonly_pubkey_parse(CTX, &xonly_pk, &rand33[1]) == 1);
        }
    }
}